

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  int iVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  byte bVar87;
  byte bVar88;
  ulong uVar89;
  uint uVar90;
  ulong uVar91;
  long lVar92;
  long lVar93;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  Geometry *pGVar94;
  uint uVar95;
  byte bVar96;
  ulong uVar97;
  float fVar98;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar147;
  float fVar149;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar104 [16];
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar153;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar154;
  undefined4 uVar155;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined8 uVar156;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar186;
  float fVar187;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  Precalculations *local_6b8;
  undefined1 local_6b0 [16];
  RTCFilterFunctionNArguments local_698;
  Geometry *local_668;
  undefined1 local_660 [32];
  undefined1 local_630 [8];
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined1 local_610 [8];
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  LinearSpace3fa *local_4b0;
  Primitive *local_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  int local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  byte local_2d0;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  int local_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar89 = (ulong)(byte)PVar11;
  lVar27 = uVar89 * 0x25;
  fVar187 = *(float *)(prim + lVar27 + 0x12);
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar102 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar103 = vsubps_avx(auVar99,*(undefined1 (*) [16])(prim + lVar27 + 6));
  fVar177 = fVar187 * auVar103._0_4_;
  fVar154 = fVar187 * auVar102._0_4_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar89 * 4 + 6);
  auVar111 = vpmovsxbd_avx2(auVar99);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar89 * 5 + 6);
  auVar110 = vpmovsxbd_avx2(auVar100);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar89 * 6 + 6);
  auVar122 = vpmovsxbd_avx2(auVar101);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + uVar89 * 0xf + 6);
  auVar121 = vpmovsxbd_avx2(auVar226);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar115 = vpmovsxbd_avx2(auVar6);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar112 = vcvtdq2ps_avx(auVar115);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar89 + 6);
  auVar113 = vpmovsxbd_avx2(auVar7);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar89 * 0x1a + 6);
  auVar120 = vpmovsxbd_avx2(auVar8);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar89 * 0x1b + 6);
  auVar114 = vpmovsxbd_avx2(auVar9);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar89 * 0x1c + 6);
  auVar109 = vpmovsxbd_avx2(auVar10);
  auVar116 = vcvtdq2ps_avx(auVar109);
  auVar199._4_4_ = fVar154;
  auVar199._0_4_ = fVar154;
  auVar199._8_4_ = fVar154;
  auVar199._12_4_ = fVar154;
  auVar199._16_4_ = fVar154;
  auVar199._20_4_ = fVar154;
  auVar199._24_4_ = fVar154;
  auVar199._28_4_ = fVar154;
  auVar218._8_4_ = 1;
  auVar218._0_8_ = 0x100000001;
  auVar218._12_4_ = 1;
  auVar218._16_4_ = 1;
  auVar218._20_4_ = 1;
  auVar218._24_4_ = 1;
  auVar218._28_4_ = 1;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar118 = ZEXT1632(CONCAT412(fVar187 * auVar102._12_4_,
                                CONCAT48(fVar187 * auVar102._8_4_,
                                         CONCAT44(fVar187 * auVar102._4_4_,fVar154))));
  auVar117 = vpermps_avx2(auVar218,auVar118);
  auVar108 = vpermps_avx512vl(auVar107,auVar118);
  fVar186 = auVar108._0_4_;
  fVar192 = auVar108._4_4_;
  auVar118._4_4_ = fVar192 * auVar122._4_4_;
  auVar118._0_4_ = fVar186 * auVar122._0_4_;
  fVar193 = auVar108._8_4_;
  auVar118._8_4_ = fVar193 * auVar122._8_4_;
  fVar194 = auVar108._12_4_;
  auVar118._12_4_ = fVar194 * auVar122._12_4_;
  fVar178 = auVar108._16_4_;
  auVar118._16_4_ = fVar178 * auVar122._16_4_;
  fVar185 = auVar108._20_4_;
  auVar118._20_4_ = fVar185 * auVar122._20_4_;
  fVar98 = auVar108._24_4_;
  auVar118._24_4_ = fVar98 * auVar122._24_4_;
  auVar118._28_4_ = auVar115._28_4_;
  auVar115._4_4_ = auVar113._4_4_ * fVar192;
  auVar115._0_4_ = auVar113._0_4_ * fVar186;
  auVar115._8_4_ = auVar113._8_4_ * fVar193;
  auVar115._12_4_ = auVar113._12_4_ * fVar194;
  auVar115._16_4_ = auVar113._16_4_ * fVar178;
  auVar115._20_4_ = auVar113._20_4_ * fVar185;
  auVar115._24_4_ = auVar113._24_4_ * fVar98;
  auVar115._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar116._4_4_ * fVar192;
  auVar109._0_4_ = auVar116._0_4_ * fVar186;
  auVar109._8_4_ = auVar116._8_4_ * fVar193;
  auVar109._12_4_ = auVar116._12_4_ * fVar194;
  auVar109._16_4_ = auVar116._16_4_ * fVar178;
  auVar109._20_4_ = auVar116._20_4_ * fVar185;
  auVar109._24_4_ = auVar116._24_4_ * fVar98;
  auVar109._28_4_ = auVar108._28_4_;
  auVar99 = vfmadd231ps_fma(auVar118,auVar117,auVar110);
  auVar100 = vfmadd231ps_fma(auVar115,auVar117,auVar112);
  auVar101 = vfmadd231ps_fma(auVar109,auVar114,auVar117);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar199,auVar111);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar199,auVar121);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar120,auVar199);
  auVar215._4_4_ = fVar177;
  auVar215._0_4_ = fVar177;
  auVar215._8_4_ = fVar177;
  auVar215._12_4_ = fVar177;
  auVar215._16_4_ = fVar177;
  auVar215._20_4_ = fVar177;
  auVar215._24_4_ = fVar177;
  auVar215._28_4_ = fVar177;
  auVar109 = ZEXT1632(CONCAT412(fVar187 * auVar103._12_4_,
                                CONCAT48(fVar187 * auVar103._8_4_,
                                         CONCAT44(fVar187 * auVar103._4_4_,fVar177))));
  auVar115 = vpermps_avx2(auVar218,auVar109);
  auVar109 = vpermps_avx512vl(auVar107,auVar109);
  fVar187 = auVar109._0_4_;
  fVar186 = auVar109._4_4_;
  auVar117._4_4_ = fVar186 * auVar122._4_4_;
  auVar117._0_4_ = fVar187 * auVar122._0_4_;
  fVar192 = auVar109._8_4_;
  auVar117._8_4_ = fVar192 * auVar122._8_4_;
  fVar193 = auVar109._12_4_;
  auVar117._12_4_ = fVar193 * auVar122._12_4_;
  fVar194 = auVar109._16_4_;
  auVar117._16_4_ = fVar194 * auVar122._16_4_;
  fVar178 = auVar109._20_4_;
  auVar117._20_4_ = fVar178 * auVar122._20_4_;
  fVar185 = auVar109._24_4_;
  auVar117._24_4_ = fVar185 * auVar122._24_4_;
  auVar117._28_4_ = fVar154;
  auVar107._4_4_ = auVar113._4_4_ * fVar186;
  auVar107._0_4_ = auVar113._0_4_ * fVar187;
  auVar107._8_4_ = auVar113._8_4_ * fVar192;
  auVar107._12_4_ = auVar113._12_4_ * fVar193;
  auVar107._16_4_ = auVar113._16_4_ * fVar194;
  auVar107._20_4_ = auVar113._20_4_ * fVar178;
  auVar107._24_4_ = auVar113._24_4_ * fVar185;
  auVar107._28_4_ = auVar122._28_4_;
  auVar113._4_4_ = auVar116._4_4_ * fVar186;
  auVar113._0_4_ = auVar116._0_4_ * fVar187;
  auVar113._8_4_ = auVar116._8_4_ * fVar192;
  auVar113._12_4_ = auVar116._12_4_ * fVar193;
  auVar113._16_4_ = auVar116._16_4_ * fVar194;
  auVar113._20_4_ = auVar116._20_4_ * fVar178;
  auVar113._24_4_ = auVar116._24_4_ * fVar185;
  auVar113._28_4_ = auVar109._28_4_;
  auVar226 = vfmadd231ps_fma(auVar117,auVar115,auVar110);
  auVar6 = vfmadd231ps_fma(auVar107,auVar115,auVar112);
  auVar7 = vfmadd231ps_fma(auVar113,auVar115,auVar114);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar226),auVar215,auVar111);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar215,auVar121);
  auVar207._8_4_ = 0x7fffffff;
  auVar207._0_8_ = 0x7fffffff7fffffff;
  auVar207._12_4_ = 0x7fffffff;
  auVar207._16_4_ = 0x7fffffff;
  auVar207._20_4_ = 0x7fffffff;
  auVar207._24_4_ = 0x7fffffff;
  auVar207._28_4_ = 0x7fffffff;
  auVar168 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar215,auVar120);
  auVar111 = vandps_avx(auVar207,ZEXT1632(auVar99));
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar203._16_4_ = 0x219392ef;
  auVar203._20_4_ = 0x219392ef;
  auVar203._24_4_ = 0x219392ef;
  auVar203._28_4_ = 0x219392ef;
  uVar91 = vcmpps_avx512vl(auVar111,auVar203,1);
  bVar18 = (bool)((byte)uVar91 & 1);
  auVar108._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar99._0_4_;
  bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar99._4_4_;
  bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar99._8_4_;
  bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar99._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar111 = vandps_avx(auVar207,ZEXT1632(auVar100));
  uVar91 = vcmpps_avx512vl(auVar111,auVar203,1);
  bVar18 = (bool)((byte)uVar91 & 1);
  auVar119._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar100._0_4_;
  bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar100._4_4_;
  bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar100._8_4_;
  bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar100._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar111 = vandps_avx(auVar207,ZEXT1632(auVar101));
  uVar91 = vcmpps_avx512vl(auVar111,auVar203,1);
  bVar18 = (bool)((byte)uVar91 & 1);
  auVar111._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._0_4_;
  bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._4_4_;
  bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._8_4_;
  bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar110 = vrcp14ps_avx512vl(auVar108);
  auVar204._8_4_ = 0x3f800000;
  auVar204._0_8_ = &DAT_3f8000003f800000;
  auVar204._12_4_ = 0x3f800000;
  auVar204._16_4_ = 0x3f800000;
  auVar204._20_4_ = 0x3f800000;
  auVar204._24_4_ = 0x3f800000;
  auVar204._28_4_ = 0x3f800000;
  auVar99 = vfnmadd213ps_fma(auVar108,auVar110,auVar204);
  auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar119);
  auVar100 = vfnmadd213ps_fma(auVar119,auVar110,auVar204);
  auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar111);
  auVar101 = vfnmadd213ps_fma(auVar111,auVar110,auVar204);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar110,auVar110);
  fVar187 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar200._4_4_ = fVar187;
  auVar200._0_4_ = fVar187;
  auVar200._8_4_ = fVar187;
  auVar200._12_4_ = fVar187;
  auVar200._16_4_ = fVar187;
  auVar200._20_4_ = fVar187;
  auVar200._24_4_ = fVar187;
  auVar200._28_4_ = fVar187;
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 7 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0xb + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 9 + 6));
  auVar226 = vfmadd213ps_fma(auVar110,auVar200,auVar111);
  auVar111 = vcvtdq2ps_avx(auVar122);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0xd + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar6 = vfmadd213ps_fma(auVar110,auVar200,auVar111);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x12 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar91 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 2 + uVar91 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar7 = vfmadd213ps_fma(auVar110,auVar200,auVar111);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x18 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar8 = vfmadd213ps_fma(auVar110,auVar200,auVar111);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x1d + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 + (ulong)(byte)PVar11 * 0x20 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar9 = vfmadd213ps_fma(auVar110,auVar200,auVar111);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar11 * 0x20 - uVar89) + 6)
                           );
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x23 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar10 = vfmadd213ps_fma(auVar110,auVar200,auVar111);
  auVar111 = vsubps_avx(ZEXT1632(auVar226),ZEXT1632(auVar102));
  auVar120._4_4_ = auVar99._4_4_ * auVar111._4_4_;
  auVar120._0_4_ = auVar99._0_4_ * auVar111._0_4_;
  auVar120._8_4_ = auVar99._8_4_ * auVar111._8_4_;
  auVar120._12_4_ = auVar99._12_4_ * auVar111._12_4_;
  auVar120._16_4_ = auVar111._16_4_ * 0.0;
  auVar120._20_4_ = auVar111._20_4_ * 0.0;
  auVar120._24_4_ = auVar111._24_4_ * 0.0;
  auVar120._28_4_ = auVar111._28_4_;
  auVar111 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar102));
  auVar176._0_4_ = auVar99._0_4_ * auVar111._0_4_;
  auVar176._4_4_ = auVar99._4_4_ * auVar111._4_4_;
  auVar176._8_4_ = auVar99._8_4_ * auVar111._8_4_;
  auVar176._12_4_ = auVar99._12_4_ * auVar111._12_4_;
  auVar176._16_4_ = auVar111._16_4_ * 0.0;
  auVar176._20_4_ = auVar111._20_4_ * 0.0;
  auVar176._24_4_ = auVar111._24_4_ * 0.0;
  auVar176._28_4_ = 0;
  auVar111 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar103));
  auVar114._4_4_ = auVar100._4_4_ * auVar111._4_4_;
  auVar114._0_4_ = auVar100._0_4_ * auVar111._0_4_;
  auVar114._8_4_ = auVar100._8_4_ * auVar111._8_4_;
  auVar114._12_4_ = auVar100._12_4_ * auVar111._12_4_;
  auVar114._16_4_ = auVar111._16_4_ * 0.0;
  auVar114._20_4_ = auVar111._20_4_ * 0.0;
  auVar114._24_4_ = auVar111._24_4_ * 0.0;
  auVar114._28_4_ = auVar111._28_4_;
  auVar111 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar103));
  auVar169._0_4_ = auVar100._0_4_ * auVar111._0_4_;
  auVar169._4_4_ = auVar100._4_4_ * auVar111._4_4_;
  auVar169._8_4_ = auVar100._8_4_ * auVar111._8_4_;
  auVar169._12_4_ = auVar100._12_4_ * auVar111._12_4_;
  auVar169._16_4_ = auVar111._16_4_ * 0.0;
  auVar169._20_4_ = auVar111._20_4_ * 0.0;
  auVar169._24_4_ = auVar111._24_4_ * 0.0;
  auVar169._28_4_ = 0;
  auVar111 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar168));
  auVar116._4_4_ = auVar101._4_4_ * auVar111._4_4_;
  auVar116._0_4_ = auVar101._0_4_ * auVar111._0_4_;
  auVar116._8_4_ = auVar101._8_4_ * auVar111._8_4_;
  auVar116._12_4_ = auVar101._12_4_ * auVar111._12_4_;
  auVar116._16_4_ = auVar111._16_4_ * 0.0;
  auVar116._20_4_ = auVar111._20_4_ * 0.0;
  auVar116._24_4_ = auVar111._24_4_ * 0.0;
  auVar116._28_4_ = auVar111._28_4_;
  auVar111 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar168));
  auVar134._0_4_ = auVar101._0_4_ * auVar111._0_4_;
  auVar134._4_4_ = auVar101._4_4_ * auVar111._4_4_;
  auVar134._8_4_ = auVar101._8_4_ * auVar111._8_4_;
  auVar134._12_4_ = auVar101._12_4_ * auVar111._12_4_;
  auVar134._16_4_ = auVar111._16_4_ * 0.0;
  auVar134._20_4_ = auVar111._20_4_ * 0.0;
  auVar134._24_4_ = auVar111._24_4_ * 0.0;
  auVar134._28_4_ = 0;
  auVar111 = vpminsd_avx2(auVar120,auVar176);
  auVar110 = vpminsd_avx2(auVar114,auVar169);
  auVar111 = vmaxps_avx(auVar111,auVar110);
  auVar110 = vpminsd_avx2(auVar116,auVar134);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar122._4_4_ = uVar155;
  auVar122._0_4_ = uVar155;
  auVar122._8_4_ = uVar155;
  auVar122._12_4_ = uVar155;
  auVar122._16_4_ = uVar155;
  auVar122._20_4_ = uVar155;
  auVar122._24_4_ = uVar155;
  auVar122._28_4_ = uVar155;
  auVar110 = vmaxps_avx512vl(auVar110,auVar122);
  auVar111 = vmaxps_avx(auVar111,auVar110);
  auVar110._8_4_ = 0x3f7ffffa;
  auVar110._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar110._12_4_ = 0x3f7ffffa;
  auVar110._16_4_ = 0x3f7ffffa;
  auVar110._20_4_ = 0x3f7ffffa;
  auVar110._24_4_ = 0x3f7ffffa;
  auVar110._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar111,auVar110);
  auVar111 = vpmaxsd_avx2(auVar120,auVar176);
  auVar110 = vpmaxsd_avx2(auVar114,auVar169);
  auVar111 = vminps_avx(auVar111,auVar110);
  auVar110 = vpmaxsd_avx2(auVar116,auVar134);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar121._4_4_ = uVar155;
  auVar121._0_4_ = uVar155;
  auVar121._8_4_ = uVar155;
  auVar121._12_4_ = uVar155;
  auVar121._16_4_ = uVar155;
  auVar121._20_4_ = uVar155;
  auVar121._24_4_ = uVar155;
  auVar121._28_4_ = uVar155;
  auVar110 = vminps_avx512vl(auVar110,auVar121);
  auVar111 = vminps_avx(auVar111,auVar110);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar111 = vmulps_avx512vl(auVar111,auVar112);
  auVar110 = vpbroadcastd_avx512vl();
  uVar25 = vpcmpgtd_avx512vl(auVar110,_DAT_0205a920);
  uVar156 = vcmpps_avx512vl(local_80,auVar111,2);
  if ((byte)((byte)uVar156 & (byte)uVar25) != 0) {
    uVar91 = (ulong)(byte)((byte)uVar156 & (byte)uVar25);
    local_4b0 = pre->ray_space + k;
    local_3d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_6b8 = pre;
    local_4a8 = prim;
    do {
      lVar27 = 0;
      for (uVar89 = uVar91; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar95 = *(uint *)(local_4a8 + 2);
      uVar12 = *(uint *)(local_4a8 + lVar27 * 4 + 6);
      pGVar94 = (context->scene->geometries).items[uVar95].ptr;
      uVar89 = (ulong)*(uint *)(*(long *)&pGVar94->field_0x58 +
                               (ulong)uVar12 *
                               pGVar94[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar187 = (pGVar94->time_range).lower;
      fVar187 = pGVar94->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar187) /
                ((pGVar94->time_range).upper - fVar187));
      auVar99 = vroundss_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),9);
      auVar99 = vminss_avx(auVar99,ZEXT416((uint)(pGVar94->fnumTimeSegments + -1.0)));
      auVar99 = vmaxss_avx(ZEXT816(0) << 0x20,auVar99);
      fVar187 = fVar187 - auVar99._0_4_;
      _Var15 = pGVar94[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar93 = (long)(int)auVar99._0_4_ * 0x38;
      lVar27 = *(long *)(_Var15 + 0x10 + lVar93);
      lVar92 = *(long *)(_Var15 + 0x38 + lVar93);
      lVar16 = *(long *)(_Var15 + 0x48 + lVar93);
      auVar103._4_4_ = fVar187;
      auVar103._0_4_ = fVar187;
      auVar103._8_4_ = fVar187;
      auVar103._12_4_ = fVar187;
      pfVar3 = (float *)(lVar92 + uVar89 * lVar16);
      auVar206._0_4_ = fVar187 * *pfVar3;
      auVar206._4_4_ = fVar187 * pfVar3[1];
      auVar206._8_4_ = fVar187 * pfVar3[2];
      auVar206._12_4_ = fVar187 * pfVar3[3];
      pfVar3 = (float *)(lVar92 + (uVar89 + 1) * lVar16);
      auVar209._0_4_ = fVar187 * *pfVar3;
      auVar209._4_4_ = fVar187 * pfVar3[1];
      auVar209._8_4_ = fVar187 * pfVar3[2];
      auVar209._12_4_ = fVar187 * pfVar3[3];
      auVar99 = vmulps_avx512vl(auVar103,*(undefined1 (*) [16])(lVar92 + (uVar89 + 2) * lVar16));
      auVar100 = vmulps_avx512vl(auVar103,*(undefined1 (*) [16])(lVar92 + lVar16 * (uVar89 + 3)));
      lVar92 = *(long *)(_Var15 + lVar93);
      fVar187 = 1.0 - fVar187;
      auVar102._4_4_ = fVar187;
      auVar102._0_4_ = fVar187;
      auVar102._8_4_ = fVar187;
      auVar102._12_4_ = fVar187;
      local_6b0 = vfmadd231ps_fma(auVar206,auVar102,*(undefined1 (*) [16])(lVar92 + lVar27 * uVar89)
                                 );
      local_5f0 = vfmadd231ps_fma(auVar209,auVar102,
                                  *(undefined1 (*) [16])(lVar92 + lVar27 * (uVar89 + 1)));
      local_600 = vfmadd231ps_avx512vl
                            (auVar99,auVar102,*(undefined1 (*) [16])(lVar92 + lVar27 * (uVar89 + 2))
                            );
      _local_610 = vfmadd231ps_avx512vl
                             (auVar100,auVar102,
                              *(undefined1 (*) [16])(lVar92 + lVar27 * (uVar89 + 3)));
      iVar13 = (int)pGVar94[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar27 = (long)iVar13 * 0x44;
      auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar101 = vsubps_avx(local_6b0,auVar99);
      uVar155 = auVar101._0_4_;
      auVar104._4_4_ = uVar155;
      auVar104._0_4_ = uVar155;
      auVar104._8_4_ = uVar155;
      auVar104._12_4_ = uVar155;
      auVar100 = vshufps_avx(auVar101,auVar101,0x55);
      aVar4 = (local_4b0->vx).field_0;
      aVar5 = (local_4b0->vy).field_0;
      fVar187 = (local_4b0->vz).field_0.m128[0];
      fVar154 = *(float *)((long)&(local_4b0->vz).field_0 + 4);
      fVar186 = *(float *)((long)&(local_4b0->vz).field_0 + 8);
      fVar192 = *(float *)((long)&(local_4b0->vz).field_0 + 0xc);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar211._0_4_ = fVar187 * auVar101._0_4_;
      auVar211._4_4_ = fVar154 * auVar101._4_4_;
      auVar211._8_4_ = fVar186 * auVar101._8_4_;
      auVar211._12_4_ = fVar192 * auVar101._12_4_;
      auVar100 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar5,auVar100);
      auVar226 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar104);
      auVar101 = vsubps_avx(local_5f0,auVar99);
      uVar155 = auVar101._0_4_;
      auVar170._4_4_ = uVar155;
      auVar170._0_4_ = uVar155;
      auVar170._8_4_ = uVar155;
      auVar170._12_4_ = uVar155;
      auVar100 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar212._0_4_ = fVar187 * auVar101._0_4_;
      auVar212._4_4_ = fVar154 * auVar101._4_4_;
      auVar212._8_4_ = fVar186 * auVar101._8_4_;
      auVar212._12_4_ = fVar192 * auVar101._12_4_;
      auVar100 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar5,auVar100);
      auVar6 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar170);
      auVar101 = vsubps_avx512vl(local_600,auVar99);
      uVar155 = auVar101._0_4_;
      auVar171._4_4_ = uVar155;
      auVar171._0_4_ = uVar155;
      auVar171._8_4_ = uVar155;
      auVar171._12_4_ = uVar155;
      auVar100 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar213._0_4_ = fVar187 * auVar101._0_4_;
      auVar213._4_4_ = fVar154 * auVar101._4_4_;
      auVar213._8_4_ = fVar186 * auVar101._8_4_;
      auVar213._12_4_ = fVar192 * auVar101._12_4_;
      auVar100 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar5,auVar100);
      auVar101 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar171);
      auVar100 = vsubps_avx512vl(_local_610,auVar99);
      uVar155 = auVar100._0_4_;
      auVar168._4_4_ = uVar155;
      auVar168._0_4_ = uVar155;
      auVar168._8_4_ = uVar155;
      auVar168._12_4_ = uVar155;
      auVar99 = vshufps_avx(auVar100,auVar100,0x55);
      auVar100 = vshufps_avx(auVar100,auVar100,0xaa);
      auVar217._0_4_ = fVar187 * auVar100._0_4_;
      auVar217._4_4_ = fVar154 * auVar100._4_4_;
      auVar217._8_4_ = fVar186 * auVar100._8_4_;
      auVar217._12_4_ = fVar192 * auVar100._12_4_;
      auVar99 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar99);
      auVar7 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar168);
      auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar155 = auVar226._0_4_;
      local_420._4_4_ = uVar155;
      local_420._0_4_ = uVar155;
      local_420._8_4_ = uVar155;
      local_420._12_4_ = uVar155;
      local_420._16_4_ = uVar155;
      local_420._20_4_ = uVar155;
      local_420._24_4_ = uVar155;
      local_420._28_4_ = uVar155;
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      auVar161._8_4_ = 1;
      auVar161._0_8_ = 0x100000001;
      auVar161._12_4_ = 1;
      auVar161._16_4_ = 1;
      auVar161._20_4_ = 1;
      auVar161._24_4_ = 1;
      auVar161._28_4_ = 1;
      local_400 = vpermps_avx2(auVar161,ZEXT1632(auVar226));
      local_440 = vbroadcastss_avx512vl(auVar6);
      local_460 = vpermps_avx512vl(auVar161,ZEXT1632(auVar6));
      auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_660 = vbroadcastss_avx512vl(auVar101);
      local_520 = vpermps_avx512vl(auVar161,ZEXT1632(auVar101));
      auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      local_540 = vbroadcastss_avx512vl(auVar7);
      auVar229 = ZEXT3264(local_540);
      local_560 = vpermps_avx512vl(auVar161,ZEXT1632(auVar7));
      auVar230 = ZEXT3264(local_560);
      auVar112 = vmulps_avx512vl(local_540,auVar121);
      auVar113 = vmulps_avx512vl(local_560,auVar121);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar122,local_660);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar122,local_520);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_440);
      auVar114 = vfmadd231ps_avx512vl(auVar113,auVar110,local_460);
      auVar115 = vfmadd231ps_avx512vl(auVar112,auVar111,local_420);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar109 = vfmadd231ps_avx512vl(auVar114,auVar111,local_400);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar116 = vmulps_avx512vl(local_540,auVar114);
      auVar117 = vmulps_avx512vl(local_560,auVar114);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar120,local_660);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar120,local_520);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar113,local_440);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,local_460);
      auVar8 = vfmadd231ps_fma(auVar116,auVar112,local_420);
      auVar9 = vfmadd231ps_fma(auVar117,auVar112,local_400);
      auVar117 = vsubps_avx512vl(ZEXT1632(auVar8),auVar115);
      auVar118 = vsubps_avx512vl(ZEXT1632(auVar9),auVar109);
      auVar116 = vmulps_avx512vl(auVar109,auVar117);
      auVar107 = vmulps_avx512vl(auVar115,auVar118);
      auVar116 = vsubps_avx512vl(auVar116,auVar107);
      auVar99 = vshufps_avx(local_6b0,local_6b0,0xff);
      uVar156 = auVar99._0_8_;
      local_a0._8_8_ = uVar156;
      local_a0._0_8_ = uVar156;
      local_a0._16_8_ = uVar156;
      local_a0._24_8_ = uVar156;
      auVar99 = vshufps_avx(local_5f0,local_5f0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar99);
      auVar99 = vshufps_avx512vl(local_600,local_600,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar99);
      auVar99 = vshufps_avx512vl(_local_610,_local_610,0xff);
      uVar156 = auVar99._0_8_;
      register0x00001248 = uVar156;
      local_100 = uVar156;
      register0x00001250 = uVar156;
      register0x00001258 = uVar156;
      auVar107 = vmulps_avx512vl(_local_100,auVar121);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar122,local_e0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,local_c0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_a0);
      auVar108 = vmulps_avx512vl(_local_100,auVar114);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar120,local_e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_c0);
      auVar10 = vfmadd231ps_fma(auVar108,auVar112,local_a0);
      auVar108 = vmulps_avx512vl(auVar118,auVar118);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,auVar117);
      auVar119 = vmaxps_avx512vl(auVar107,ZEXT1632(auVar10));
      auVar119 = vmulps_avx512vl(auVar119,auVar119);
      auVar108 = vmulps_avx512vl(auVar119,auVar108);
      auVar116 = vmulps_avx512vl(auVar116,auVar116);
      uVar156 = vcmpps_avx512vl(auVar116,auVar108,2);
      auVar99 = vblendps_avx(auVar226,local_6b0,8);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar100 = vandps_avx512vl(auVar99,auVar102);
      auVar99 = vblendps_avx(auVar6,local_5f0,8);
      auVar99 = vandps_avx512vl(auVar99,auVar102);
      auVar100 = vmaxps_avx(auVar100,auVar99);
      auVar99 = vblendps_avx(auVar101,local_600,8);
      auVar103 = vandps_avx512vl(auVar99,auVar102);
      auVar99 = vblendps_avx(auVar7,_local_610,8);
      auVar99 = vandps_avx512vl(auVar99,auVar102);
      auVar99 = vmaxps_avx(auVar103,auVar99);
      auVar99 = vmaxps_avx(auVar100,auVar99);
      auVar100 = vmovshdup_avx(auVar99);
      auVar100 = vmaxss_avx(auVar100,auVar99);
      auVar99 = vshufpd_avx(auVar99,auVar99,1);
      auVar99 = vmaxss_avx(auVar99,auVar100);
      _local_3a0 = vcvtsi2ss_avx512f(local_600,iVar13);
      auVar208._0_4_ = local_3a0._0_4_;
      auVar208._4_4_ = auVar208._0_4_;
      auVar208._8_4_ = auVar208._0_4_;
      auVar208._12_4_ = auVar208._0_4_;
      auVar208._16_4_ = auVar208._0_4_;
      auVar208._20_4_ = auVar208._0_4_;
      auVar208._24_4_ = auVar208._0_4_;
      auVar208._28_4_ = auVar208._0_4_;
      uVar25 = vcmpps_avx512vl(auVar208,_DAT_02020f40,0xe);
      bVar96 = (byte)uVar156 & (byte)uVar25;
      fVar154 = auVar99._0_4_ * 4.7683716e-07;
      auVar183._8_4_ = 2;
      auVar183._0_8_ = 0x200000002;
      auVar183._12_4_ = 2;
      auVar183._16_4_ = 2;
      auVar183._20_4_ = 2;
      auVar183._24_4_ = 2;
      auVar183._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar183,ZEXT1632(auVar226));
      local_140 = vpermps_avx512vl(auVar183,ZEXT1632(auVar6));
      local_160 = vpermps_avx512vl(auVar183,ZEXT1632(auVar101));
      auVar116 = vpermps_avx2(auVar183,ZEXT1632(auVar7));
      fVar187 = *(float *)(ray + k * 4 + 0x30);
      auVar99 = auVar118._0_16_;
      _local_630 = ZEXT416((uint)fVar154);
      if (bVar96 == 0) {
        auVar99 = vxorps_avx512vl(auVar99,auVar99);
        auVar227 = ZEXT1664(auVar99);
        auVar223 = ZEXT3264(local_420);
        auVar224 = ZEXT3264(local_400);
        auVar225 = ZEXT3264(local_440);
        auVar221 = ZEXT3264(local_460);
        auVar231 = ZEXT3264(local_660);
        auVar228 = ZEXT3264(local_520);
      }
      else {
        fStack_49c = 0.0;
        fStack_498 = 0.0;
        fStack_494 = 0.0;
        auVar114 = vmulps_avx512vl(auVar116,auVar114);
        auVar120 = vfmadd213ps_avx512vl(auVar120,local_160,auVar114);
        auVar113 = vfmadd213ps_avx512vl(auVar113,local_140,auVar120);
        auVar113 = vfmadd213ps_avx512vl(auVar112,local_120,auVar113);
        auVar121 = vmulps_avx512vl(auVar116,auVar121);
        auVar122 = vfmadd213ps_avx512vl(auVar122,local_160,auVar121);
        auVar120 = vfmadd213ps_avx512vl(auVar110,local_140,auVar122);
        auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar120 = vfmadd213ps_avx512vl(auVar111,local_120,auVar120);
        auVar111 = vmulps_avx512vl(local_540,auVar112);
        auVar114 = vmulps_avx512vl(local_560,auVar112);
        auVar214._0_4_ = auVar116._0_4_ * auVar112._0_4_;
        auVar214._4_4_ = auVar116._4_4_ * auVar112._4_4_;
        auVar214._8_4_ = auVar116._8_4_ * auVar112._8_4_;
        auVar214._12_4_ = auVar116._12_4_ * auVar112._12_4_;
        auVar214._16_4_ = auVar116._16_4_ * auVar112._16_4_;
        auVar214._20_4_ = auVar116._20_4_ * auVar112._20_4_;
        auVar214._24_4_ = auVar116._24_4_ * auVar112._24_4_;
        auVar214._28_4_ = 0;
        auVar231 = ZEXT3264(local_660);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar121,local_660);
        auVar112 = vfmadd231ps_avx512vl(auVar114,auVar121,local_520);
        auVar121 = vfmadd231ps_avx512vl(auVar214,local_160,auVar121);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar122,local_440);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar122,local_460);
        auVar114 = vfmadd231ps_avx512vl(auVar121,local_140,auVar122);
        auVar108 = vfmadd231ps_avx512vl(auVar111,auVar110,local_420);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_400);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_120,auVar110);
        auVar110 = vmulps_avx512vl(local_540,auVar121);
        auVar119 = vmulps_avx512vl(local_560,auVar121);
        auVar39._4_4_ = auVar116._4_4_ * auVar121._4_4_;
        auVar39._0_4_ = auVar116._0_4_ * auVar121._0_4_;
        auVar39._8_4_ = auVar116._8_4_ * auVar121._8_4_;
        auVar39._12_4_ = auVar116._12_4_ * auVar121._12_4_;
        auVar39._16_4_ = auVar116._16_4_ * auVar121._16_4_;
        auVar39._20_4_ = auVar116._20_4_ * auVar121._20_4_;
        auVar39._24_4_ = auVar116._24_4_ * auVar121._24_4_;
        auVar39._28_4_ = auVar121._28_4_;
        auVar121 = vfmadd231ps_avx512vl(auVar110,auVar122,local_660);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,local_520);
        auVar122 = vfmadd231ps_avx512vl(auVar39,local_160,auVar122);
        auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar110,local_440);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar110,local_460);
        auVar110 = vfmadd231ps_avx512vl(auVar122,local_140,auVar110);
        auVar122 = vfmadd231ps_avx512vl(auVar121,auVar111,local_420);
        auVar121 = vfmadd231ps_avx512vl(auVar119,auVar111,local_400);
        auVar119 = vfmadd231ps_avx512vl(auVar110,local_120,auVar111);
        auVar219._8_4_ = 0x7fffffff;
        auVar219._0_8_ = 0x7fffffff7fffffff;
        auVar219._12_4_ = 0x7fffffff;
        auVar219._16_4_ = 0x7fffffff;
        auVar219._20_4_ = 0x7fffffff;
        auVar219._24_4_ = 0x7fffffff;
        auVar219._28_4_ = 0x7fffffff;
        auVar111 = vandps_avx(auVar108,auVar219);
        auVar110 = vandps_avx(auVar112,auVar219);
        auVar110 = vmaxps_avx(auVar111,auVar110);
        auVar111 = vandps_avx(auVar114,auVar219);
        auVar111 = vmaxps_avx(auVar110,auVar111);
        auVar114 = vbroadcastss_avx512vl(_local_630);
        uVar89 = vcmpps_avx512vl(auVar111,auVar114,1);
        bVar18 = (bool)((byte)uVar89 & 1);
        auVar123._0_4_ = (float)((uint)bVar18 * auVar117._0_4_ | (uint)!bVar18 * auVar108._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar18 * auVar117._4_4_ | (uint)!bVar18 * auVar108._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar18 * auVar117._8_4_ | (uint)!bVar18 * auVar108._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar18 * auVar117._12_4_ | (uint)!bVar18 * auVar108._12_4_);
        bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar18 * auVar117._16_4_ | (uint)!bVar18 * auVar108._16_4_);
        bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar18 * auVar117._20_4_ | (uint)!bVar18 * auVar108._20_4_);
        bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar18 * auVar117._24_4_ | (uint)!bVar18 * auVar108._24_4_);
        bVar18 = SUB81(uVar89 >> 7,0);
        auVar123._28_4_ = (uint)bVar18 * auVar117._28_4_ | (uint)!bVar18 * auVar108._28_4_;
        bVar18 = (bool)((byte)uVar89 & 1);
        auVar124._0_4_ = (float)((uint)bVar18 * auVar118._0_4_ | (uint)!bVar18 * auVar112._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar18 * auVar118._4_4_ | (uint)!bVar18 * auVar112._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar18 * auVar118._8_4_ | (uint)!bVar18 * auVar112._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar18 * auVar118._12_4_ | (uint)!bVar18 * auVar112._12_4_);
        bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar18 * auVar118._16_4_ | (uint)!bVar18 * auVar112._16_4_);
        bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar18 * auVar118._20_4_ | (uint)!bVar18 * auVar112._20_4_);
        bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar18 * auVar118._24_4_ | (uint)!bVar18 * auVar112._24_4_);
        bVar18 = SUB81(uVar89 >> 7,0);
        auVar124._28_4_ = (uint)bVar18 * auVar118._28_4_ | (uint)!bVar18 * auVar112._28_4_;
        auVar111 = vandps_avx(auVar219,auVar122);
        auVar110 = vandps_avx(auVar121,auVar219);
        auVar110 = vmaxps_avx(auVar111,auVar110);
        auVar111 = vandps_avx(auVar119,auVar219);
        auVar111 = vmaxps_avx(auVar110,auVar111);
        uVar89 = vcmpps_avx512vl(auVar111,auVar114,1);
        bVar18 = (bool)((byte)uVar89 & 1);
        auVar125._0_4_ = (float)((uint)bVar18 * auVar117._0_4_ | (uint)!bVar18 * auVar122._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar18 * auVar117._4_4_ | (uint)!bVar18 * auVar122._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar18 * auVar117._8_4_ | (uint)!bVar18 * auVar122._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar18 * auVar117._12_4_ | (uint)!bVar18 * auVar122._12_4_);
        bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar18 * auVar117._16_4_ | (uint)!bVar18 * auVar122._16_4_);
        bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar18 * auVar117._20_4_ | (uint)!bVar18 * auVar122._20_4_);
        bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar18 * auVar117._24_4_ | (uint)!bVar18 * auVar122._24_4_);
        bVar18 = SUB81(uVar89 >> 7,0);
        auVar125._28_4_ = (uint)bVar18 * auVar117._28_4_ | (uint)!bVar18 * auVar122._28_4_;
        bVar18 = (bool)((byte)uVar89 & 1);
        auVar126._0_4_ = (float)((uint)bVar18 * auVar118._0_4_ | (uint)!bVar18 * auVar121._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar18 * auVar118._4_4_ | (uint)!bVar18 * auVar121._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar18 * auVar118._8_4_ | (uint)!bVar18 * auVar121._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar18 * auVar118._12_4_ | (uint)!bVar18 * auVar121._12_4_);
        bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar18 * auVar118._16_4_ | (uint)!bVar18 * auVar121._16_4_);
        bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar18 * auVar118._20_4_ | (uint)!bVar18 * auVar121._20_4_);
        bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar18 * auVar118._24_4_ | (uint)!bVar18 * auVar121._24_4_);
        bVar18 = SUB81(uVar89 >> 7,0);
        auVar126._28_4_ = (uint)bVar18 * auVar118._28_4_ | (uint)!bVar18 * auVar121._28_4_;
        auVar104 = vxorps_avx512vl(auVar99,auVar99);
        auVar227 = ZEXT1664(auVar104);
        auVar111 = vfmadd213ps_avx512vl(auVar123,auVar123,ZEXT1632(auVar104));
        auVar99 = vfmadd231ps_fma(auVar111,auVar124,auVar124);
        auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar99));
        fVar186 = auVar111._0_4_;
        fVar192 = auVar111._4_4_;
        fVar193 = auVar111._8_4_;
        fVar194 = auVar111._12_4_;
        fVar178 = auVar111._16_4_;
        fVar185 = auVar111._20_4_;
        fVar98 = auVar111._24_4_;
        auVar40._4_4_ = fVar192 * fVar192 * fVar192 * auVar99._4_4_ * -0.5;
        auVar40._0_4_ = fVar186 * fVar186 * fVar186 * auVar99._0_4_ * -0.5;
        auVar40._8_4_ = fVar193 * fVar193 * fVar193 * auVar99._8_4_ * -0.5;
        auVar40._12_4_ = fVar194 * fVar194 * fVar194 * auVar99._12_4_ * -0.5;
        auVar40._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar40._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar40._24_4_ = fVar98 * fVar98 * fVar98 * -0.0;
        auVar40._28_4_ = auVar119._28_4_;
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar111 = vfmadd231ps_avx512vl(auVar40,auVar110,auVar111);
        auVar41._4_4_ = auVar124._4_4_ * auVar111._4_4_;
        auVar41._0_4_ = auVar124._0_4_ * auVar111._0_4_;
        auVar41._8_4_ = auVar124._8_4_ * auVar111._8_4_;
        auVar41._12_4_ = auVar124._12_4_ * auVar111._12_4_;
        auVar41._16_4_ = auVar124._16_4_ * auVar111._16_4_;
        auVar41._20_4_ = auVar124._20_4_ * auVar111._20_4_;
        auVar41._24_4_ = auVar124._24_4_ * auVar111._24_4_;
        auVar41._28_4_ = 0;
        auVar42._4_4_ = auVar111._4_4_ * -auVar123._4_4_;
        auVar42._0_4_ = auVar111._0_4_ * -auVar123._0_4_;
        auVar42._8_4_ = auVar111._8_4_ * -auVar123._8_4_;
        auVar42._12_4_ = auVar111._12_4_ * -auVar123._12_4_;
        auVar42._16_4_ = auVar111._16_4_ * -auVar123._16_4_;
        auVar42._20_4_ = auVar111._20_4_ * -auVar123._20_4_;
        auVar42._24_4_ = auVar111._24_4_ * -auVar123._24_4_;
        auVar42._28_4_ = auVar124._28_4_;
        auVar111 = vmulps_avx512vl(auVar111,ZEXT1632(auVar104));
        auVar117 = ZEXT1632(auVar104);
        auVar122 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar117);
        auVar99 = vfmadd231ps_fma(auVar122,auVar126,auVar126);
        auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar99));
        fVar186 = auVar122._0_4_;
        fVar192 = auVar122._4_4_;
        fVar193 = auVar122._8_4_;
        fVar194 = auVar122._12_4_;
        fVar178 = auVar122._16_4_;
        fVar185 = auVar122._20_4_;
        fVar98 = auVar122._24_4_;
        auVar43._4_4_ = fVar192 * fVar192 * fVar192 * auVar99._4_4_ * -0.5;
        auVar43._0_4_ = fVar186 * fVar186 * fVar186 * auVar99._0_4_ * -0.5;
        auVar43._8_4_ = fVar193 * fVar193 * fVar193 * auVar99._8_4_ * -0.5;
        auVar43._12_4_ = fVar194 * fVar194 * fVar194 * auVar99._12_4_ * -0.5;
        auVar43._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar43._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar43._24_4_ = fVar98 * fVar98 * fVar98 * -0.0;
        auVar43._28_4_ = 0;
        auVar110 = vfmadd231ps_avx512vl(auVar43,auVar110,auVar122);
        auVar44._4_4_ = auVar126._4_4_ * auVar110._4_4_;
        auVar44._0_4_ = auVar126._0_4_ * auVar110._0_4_;
        auVar44._8_4_ = auVar126._8_4_ * auVar110._8_4_;
        auVar44._12_4_ = auVar126._12_4_ * auVar110._12_4_;
        auVar44._16_4_ = auVar126._16_4_ * auVar110._16_4_;
        auVar44._20_4_ = auVar126._20_4_ * auVar110._20_4_;
        auVar44._24_4_ = auVar126._24_4_ * auVar110._24_4_;
        auVar44._28_4_ = auVar122._28_4_;
        auVar45._4_4_ = -auVar125._4_4_ * auVar110._4_4_;
        auVar45._0_4_ = -auVar125._0_4_ * auVar110._0_4_;
        auVar45._8_4_ = -auVar125._8_4_ * auVar110._8_4_;
        auVar45._12_4_ = -auVar125._12_4_ * auVar110._12_4_;
        auVar45._16_4_ = -auVar125._16_4_ * auVar110._16_4_;
        auVar45._20_4_ = -auVar125._20_4_ * auVar110._20_4_;
        auVar45._24_4_ = -auVar125._24_4_ * auVar110._24_4_;
        auVar45._28_4_ = auVar125._28_4_ ^ 0x80000000;
        auVar110 = vmulps_avx512vl(auVar110,auVar117);
        auVar99 = vfmadd213ps_fma(auVar41,auVar107,auVar115);
        auVar100 = vfmadd213ps_fma(auVar42,auVar107,auVar109);
        auVar122 = vfmadd213ps_avx512vl(auVar111,auVar107,auVar120);
        auVar121 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar10),ZEXT1632(auVar8));
        auVar102 = vfnmadd213ps_fma(auVar41,auVar107,auVar115);
        auVar114 = ZEXT1632(auVar10);
        auVar101 = vfmadd213ps_fma(auVar45,auVar114,ZEXT1632(auVar9));
        auVar103 = vfnmadd213ps_fma(auVar42,auVar107,auVar109);
        auVar226 = vfmadd213ps_fma(auVar110,auVar114,auVar113);
        auVar112 = vfnmadd231ps_avx512vl(auVar120,auVar107,auVar111);
        auVar8 = vfnmadd213ps_fma(auVar44,auVar114,ZEXT1632(auVar8));
        auVar9 = vfnmadd213ps_fma(auVar45,auVar114,ZEXT1632(auVar9));
        auVar168 = vfnmadd231ps_fma(auVar113,ZEXT1632(auVar10),auVar110);
        auVar110 = vsubps_avx512vl(auVar121,ZEXT1632(auVar102));
        auVar111 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar103));
        auVar113 = vsubps_avx512vl(ZEXT1632(auVar226),auVar112);
        auVar120 = vmulps_avx512vl(auVar111,auVar112);
        auVar6 = vfmsub231ps_fma(auVar120,ZEXT1632(auVar103),auVar113);
        auVar46._4_4_ = auVar102._4_4_ * auVar113._4_4_;
        auVar46._0_4_ = auVar102._0_4_ * auVar113._0_4_;
        auVar46._8_4_ = auVar102._8_4_ * auVar113._8_4_;
        auVar46._12_4_ = auVar102._12_4_ * auVar113._12_4_;
        auVar46._16_4_ = auVar113._16_4_ * 0.0;
        auVar46._20_4_ = auVar113._20_4_ * 0.0;
        auVar46._24_4_ = auVar113._24_4_ * 0.0;
        auVar46._28_4_ = auVar113._28_4_;
        auVar113 = vfmsub231ps_avx512vl(auVar46,auVar112,auVar110);
        auVar47._4_4_ = auVar103._4_4_ * auVar110._4_4_;
        auVar47._0_4_ = auVar103._0_4_ * auVar110._0_4_;
        auVar47._8_4_ = auVar103._8_4_ * auVar110._8_4_;
        auVar47._12_4_ = auVar103._12_4_ * auVar110._12_4_;
        auVar47._16_4_ = auVar110._16_4_ * 0.0;
        auVar47._20_4_ = auVar110._20_4_ * 0.0;
        auVar47._24_4_ = auVar110._24_4_ * 0.0;
        auVar47._28_4_ = auVar110._28_4_;
        auVar7 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar102),auVar111);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar117,auVar113);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,ZEXT1632(auVar6));
        auVar118 = ZEXT1632(auVar104);
        uVar89 = vcmpps_avx512vl(auVar111,auVar118,2);
        bVar88 = (byte)uVar89;
        fVar98 = (float)((uint)(bVar88 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar8._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar147 = (float)((uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar8._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar149 = (float)((uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar8._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar151 = (float)((uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar8._12_4_);
        auVar120 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar149,CONCAT44(fVar147,fVar98))));
        fVar177 = (float)((uint)(bVar88 & 1) * auVar100._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * auVar9._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar148 = (float)((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar9._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar150 = (float)((uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar9._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar152 = (float)((uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar9._12_4_);
        auVar114 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar177))));
        auVar127._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar122._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar168._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar168._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar168._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar168._12_4_);
        fVar186 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar122._16_4_);
        auVar127._16_4_ = fVar186;
        fVar192 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar122._20_4_);
        auVar127._20_4_ = fVar192;
        fVar193 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar122._24_4_);
        auVar127._24_4_ = fVar193;
        iVar1 = (uint)(byte)(uVar89 >> 7) * auVar122._28_4_;
        auVar127._28_4_ = iVar1;
        auVar110 = vblendmps_avx512vl(ZEXT1632(auVar102),auVar121);
        auVar128._0_4_ =
             (uint)(bVar88 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar6._0_4_;
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar18 * auVar110._4_4_ | (uint)!bVar18 * auVar6._4_4_;
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar18 * auVar110._8_4_ | (uint)!bVar18 * auVar6._8_4_;
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar18 * auVar110._12_4_ | (uint)!bVar18 * auVar6._12_4_;
        auVar128._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar110._16_4_;
        auVar128._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar110._20_4_;
        auVar128._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar110._24_4_;
        auVar128._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar110._28_4_;
        auVar110 = vblendmps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar101));
        auVar129._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar110._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar100._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar18 * auVar110._4_4_ | (uint)!bVar18 * auVar100._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar18 * auVar110._8_4_ | (uint)!bVar18 * auVar100._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar18 * auVar110._12_4_ | (uint)!bVar18 * auVar100._12_4_);
        fVar178 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar110._16_4_);
        auVar129._16_4_ = fVar178;
        fVar185 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar110._20_4_);
        auVar129._20_4_ = fVar185;
        fVar194 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar110._24_4_);
        auVar129._24_4_ = fVar194;
        auVar129._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar110._28_4_;
        auVar110 = vblendmps_avx512vl(auVar112,ZEXT1632(auVar226));
        auVar130._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar110._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar122._0_4_);
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar18 * auVar110._4_4_ | (uint)!bVar18 * auVar122._4_4_);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar18 * auVar110._8_4_ | (uint)!bVar18 * auVar122._8_4_);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar18 * auVar110._12_4_ | (uint)!bVar18 * auVar122._12_4_);
        bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar18 * auVar110._16_4_ | (uint)!bVar18 * auVar122._16_4_);
        bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar18 * auVar110._20_4_ | (uint)!bVar18 * auVar122._20_4_);
        bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar18 * auVar110._24_4_ | (uint)!bVar18 * auVar122._24_4_);
        bVar18 = SUB81(uVar89 >> 7,0);
        auVar130._28_4_ = (uint)bVar18 * auVar110._28_4_ | (uint)!bVar18 * auVar122._28_4_;
        auVar131._0_4_ =
             (uint)(bVar88 & 1) * (int)auVar102._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar121._0_4_;
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar18 * (int)auVar102._4_4_ | (uint)!bVar18 * auVar121._4_4_;
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar18 * (int)auVar102._8_4_ | (uint)!bVar18 * auVar121._8_4_;
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar18 * (int)auVar102._12_4_ | (uint)!bVar18 * auVar121._12_4_;
        auVar131._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar121._16_4_;
        auVar131._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar121._20_4_;
        auVar131._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar121._24_4_;
        auVar131._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar121._28_4_;
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar132._0_4_ =
             (uint)(bVar88 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar226._0_4_;
        bVar19 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar19 * auVar112._4_4_ | (uint)!bVar19 * auVar226._4_4_;
        bVar19 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar19 * auVar112._8_4_ | (uint)!bVar19 * auVar226._8_4_;
        bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar19 * auVar112._12_4_ | (uint)!bVar19 * auVar226._12_4_;
        auVar132._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar112._16_4_;
        auVar132._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar112._20_4_;
        auVar132._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar112._24_4_;
        iVar2 = (uint)(byte)(uVar89 >> 7) * auVar112._28_4_;
        auVar132._28_4_ = iVar2;
        auVar115 = vsubps_avx512vl(auVar131,auVar120);
        auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar103._12_4_ |
                                                 (uint)!bVar21 * auVar101._12_4_,
                                                 CONCAT48((uint)bVar20 * (int)auVar103._8_4_ |
                                                          (uint)!bVar20 * auVar101._8_4_,
                                                          CONCAT44((uint)bVar18 *
                                                                   (int)auVar103._4_4_ |
                                                                   (uint)!bVar18 * auVar101._4_4_,
                                                                   (uint)(bVar88 & 1) *
                                                                   (int)auVar103._0_4_ |
                                                                   (uint)!(bool)(bVar88 & 1) *
                                                                   auVar101._0_4_)))),auVar114);
        auVar122 = vsubps_avx(auVar132,auVar127);
        auVar121 = vsubps_avx(auVar120,auVar128);
        auVar112 = vsubps_avx(auVar114,auVar129);
        auVar113 = vsubps_avx(auVar127,auVar130);
        auVar48._4_4_ = auVar122._4_4_ * fVar147;
        auVar48._0_4_ = auVar122._0_4_ * fVar98;
        auVar48._8_4_ = auVar122._8_4_ * fVar149;
        auVar48._12_4_ = auVar122._12_4_ * fVar151;
        auVar48._16_4_ = auVar122._16_4_ * 0.0;
        auVar48._20_4_ = auVar122._20_4_ * 0.0;
        auVar48._24_4_ = auVar122._24_4_ * 0.0;
        auVar48._28_4_ = iVar2;
        auVar99 = vfmsub231ps_fma(auVar48,auVar127,auVar115);
        auVar49._4_4_ = fVar148 * auVar115._4_4_;
        auVar49._0_4_ = fVar177 * auVar115._0_4_;
        auVar49._8_4_ = fVar150 * auVar115._8_4_;
        auVar49._12_4_ = fVar152 * auVar115._12_4_;
        auVar49._16_4_ = auVar115._16_4_ * 0.0;
        auVar49._20_4_ = auVar115._20_4_ * 0.0;
        auVar49._24_4_ = auVar115._24_4_ * 0.0;
        auVar49._28_4_ = auVar111._28_4_;
        auVar100 = vfmsub231ps_fma(auVar49,auVar120,auVar110);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar118,ZEXT1632(auVar99));
        auVar188._0_4_ = auVar110._0_4_ * auVar127._0_4_;
        auVar188._4_4_ = auVar110._4_4_ * auVar127._4_4_;
        auVar188._8_4_ = auVar110._8_4_ * auVar127._8_4_;
        auVar188._12_4_ = auVar110._12_4_ * auVar127._12_4_;
        auVar188._16_4_ = auVar110._16_4_ * fVar186;
        auVar188._20_4_ = auVar110._20_4_ * fVar192;
        auVar188._24_4_ = auVar110._24_4_ * fVar193;
        auVar188._28_4_ = 0;
        auVar99 = vfmsub231ps_fma(auVar188,auVar114,auVar122);
        auVar109 = vfmadd231ps_avx512vl(auVar111,auVar118,ZEXT1632(auVar99));
        auVar111 = vmulps_avx512vl(auVar113,auVar128);
        auVar111 = vfmsub231ps_avx512vl(auVar111,auVar121,auVar130);
        auVar50._4_4_ = auVar112._4_4_ * auVar130._4_4_;
        auVar50._0_4_ = auVar112._0_4_ * auVar130._0_4_;
        auVar50._8_4_ = auVar112._8_4_ * auVar130._8_4_;
        auVar50._12_4_ = auVar112._12_4_ * auVar130._12_4_;
        auVar50._16_4_ = auVar112._16_4_ * auVar130._16_4_;
        auVar50._20_4_ = auVar112._20_4_ * auVar130._20_4_;
        auVar50._24_4_ = auVar112._24_4_ * auVar130._24_4_;
        auVar50._28_4_ = auVar130._28_4_;
        auVar99 = vfmsub231ps_fma(auVar50,auVar129,auVar113);
        auVar189._0_4_ = auVar129._0_4_ * auVar121._0_4_;
        auVar189._4_4_ = auVar129._4_4_ * auVar121._4_4_;
        auVar189._8_4_ = auVar129._8_4_ * auVar121._8_4_;
        auVar189._12_4_ = auVar129._12_4_ * auVar121._12_4_;
        auVar189._16_4_ = fVar178 * auVar121._16_4_;
        auVar189._20_4_ = fVar185 * auVar121._20_4_;
        auVar189._24_4_ = fVar194 * auVar121._24_4_;
        auVar189._28_4_ = 0;
        auVar100 = vfmsub231ps_fma(auVar189,auVar112,auVar128);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar118,auVar111);
        auVar117 = vfmadd231ps_avx512vl(auVar111,auVar118,ZEXT1632(auVar99));
        auVar111 = vmaxps_avx(auVar109,auVar117);
        uVar156 = vcmpps_avx512vl(auVar111,auVar118,2);
        bVar96 = bVar96 & (byte)uVar156;
        auVar223 = ZEXT3264(local_420);
        auVar224 = ZEXT3264(local_400);
        auVar225 = ZEXT3264(local_440);
        auVar221 = ZEXT3264(local_460);
        auVar216 = ZEXT1664(_local_630);
        if (bVar96 == 0) {
          bVar96 = 0;
        }
        else {
          auVar51._4_4_ = auVar113._4_4_ * auVar110._4_4_;
          auVar51._0_4_ = auVar113._0_4_ * auVar110._0_4_;
          auVar51._8_4_ = auVar113._8_4_ * auVar110._8_4_;
          auVar51._12_4_ = auVar113._12_4_ * auVar110._12_4_;
          auVar51._16_4_ = auVar113._16_4_ * auVar110._16_4_;
          auVar51._20_4_ = auVar113._20_4_ * auVar110._20_4_;
          auVar51._24_4_ = auVar113._24_4_ * auVar110._24_4_;
          auVar51._28_4_ = auVar111._28_4_;
          auVar101 = vfmsub231ps_fma(auVar51,auVar112,auVar122);
          auVar52._4_4_ = auVar122._4_4_ * auVar121._4_4_;
          auVar52._0_4_ = auVar122._0_4_ * auVar121._0_4_;
          auVar52._8_4_ = auVar122._8_4_ * auVar121._8_4_;
          auVar52._12_4_ = auVar122._12_4_ * auVar121._12_4_;
          auVar52._16_4_ = auVar122._16_4_ * auVar121._16_4_;
          auVar52._20_4_ = auVar122._20_4_ * auVar121._20_4_;
          auVar52._24_4_ = auVar122._24_4_ * auVar121._24_4_;
          auVar52._28_4_ = auVar122._28_4_;
          auVar100 = vfmsub231ps_fma(auVar52,auVar115,auVar113);
          auVar53._4_4_ = auVar112._4_4_ * auVar115._4_4_;
          auVar53._0_4_ = auVar112._0_4_ * auVar115._0_4_;
          auVar53._8_4_ = auVar112._8_4_ * auVar115._8_4_;
          auVar53._12_4_ = auVar112._12_4_ * auVar115._12_4_;
          auVar53._16_4_ = auVar112._16_4_ * auVar115._16_4_;
          auVar53._20_4_ = auVar112._20_4_ * auVar115._20_4_;
          auVar53._24_4_ = auVar112._24_4_ * auVar115._24_4_;
          auVar53._28_4_ = auVar112._28_4_;
          auVar226 = vfmsub231ps_fma(auVar53,auVar121,auVar110);
          auVar99 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar226));
          auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar101),auVar118);
          auVar110 = vrcp14ps_avx512vl(auVar111);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar122 = vfnmadd213ps_avx512vl(auVar110,auVar111,auVar28);
          auVar99 = vfmadd132ps_fma(auVar122,auVar110,auVar110);
          auVar54._4_4_ = auVar226._4_4_ * auVar127._4_4_;
          auVar54._0_4_ = auVar226._0_4_ * auVar127._0_4_;
          auVar54._8_4_ = auVar226._8_4_ * auVar127._8_4_;
          auVar54._12_4_ = auVar226._12_4_ * auVar127._12_4_;
          auVar54._16_4_ = fVar186 * 0.0;
          auVar54._20_4_ = fVar192 * 0.0;
          auVar54._24_4_ = fVar193 * 0.0;
          auVar54._28_4_ = iVar1;
          auVar100 = vfmadd231ps_fma(auVar54,auVar114,ZEXT1632(auVar100));
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar120,ZEXT1632(auVar101));
          fVar186 = auVar99._0_4_;
          fVar192 = auVar99._4_4_;
          fVar193 = auVar99._8_4_;
          fVar194 = auVar99._12_4_;
          auVar110 = ZEXT1632(CONCAT412(auVar100._12_4_ * fVar194,
                                        CONCAT48(auVar100._8_4_ * fVar193,
                                                 CONCAT44(auVar100._4_4_ * fVar192,
                                                          auVar100._0_4_ * fVar186))));
          auVar205._4_4_ = fVar187;
          auVar205._0_4_ = fVar187;
          auVar205._8_4_ = fVar187;
          auVar205._12_4_ = fVar187;
          auVar205._16_4_ = fVar187;
          auVar205._20_4_ = fVar187;
          auVar205._24_4_ = fVar187;
          auVar205._28_4_ = fVar187;
          uVar156 = vcmpps_avx512vl(auVar205,auVar110,2);
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar29._4_4_ = uVar155;
          auVar29._0_4_ = uVar155;
          auVar29._8_4_ = uVar155;
          auVar29._12_4_ = uVar155;
          auVar29._16_4_ = uVar155;
          auVar29._20_4_ = uVar155;
          auVar29._24_4_ = uVar155;
          auVar29._28_4_ = uVar155;
          uVar25 = vcmpps_avx512vl(auVar110,auVar29,2);
          bVar96 = (byte)uVar156 & (byte)uVar25 & bVar96;
          if (bVar96 != 0) {
            uVar156 = vcmpps_avx512vl(auVar111,auVar118,4);
            if ((bVar96 & (byte)uVar156) != 0) {
              bVar96 = bVar96 & (byte)uVar156;
              fVar178 = auVar109._0_4_ * fVar186;
              fVar185 = auVar109._4_4_ * fVar192;
              auVar55._4_4_ = fVar185;
              auVar55._0_4_ = fVar178;
              fVar98 = auVar109._8_4_ * fVar193;
              auVar55._8_4_ = fVar98;
              fVar177 = auVar109._12_4_ * fVar194;
              auVar55._12_4_ = fVar177;
              fVar147 = auVar109._16_4_ * 0.0;
              auVar55._16_4_ = fVar147;
              fVar148 = auVar109._20_4_ * 0.0;
              auVar55._20_4_ = fVar148;
              fVar149 = auVar109._24_4_ * 0.0;
              auVar55._24_4_ = fVar149;
              auVar55._28_4_ = auVar109._28_4_;
              fVar186 = auVar117._0_4_ * fVar186;
              fVar192 = auVar117._4_4_ * fVar192;
              auVar56._4_4_ = fVar192;
              auVar56._0_4_ = fVar186;
              fVar193 = auVar117._8_4_ * fVar193;
              auVar56._8_4_ = fVar193;
              fVar194 = auVar117._12_4_ * fVar194;
              auVar56._12_4_ = fVar194;
              fVar150 = auVar117._16_4_ * 0.0;
              auVar56._16_4_ = fVar150;
              fVar151 = auVar117._20_4_ * 0.0;
              auVar56._20_4_ = fVar151;
              fVar152 = auVar117._24_4_ * 0.0;
              auVar56._24_4_ = fVar152;
              auVar56._28_4_ = auVar117._28_4_;
              auVar201._8_4_ = 0x3f800000;
              auVar201._0_8_ = &DAT_3f8000003f800000;
              auVar201._12_4_ = 0x3f800000;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar201,auVar55);
              local_580._0_4_ =
                   (uint)(bVar88 & 1) * (int)fVar178 | (uint)!(bool)(bVar88 & 1) * auVar111._0_4_;
              bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
              local_580._4_4_ = (uint)bVar18 * (int)fVar185 | (uint)!bVar18 * auVar111._4_4_;
              bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
              local_580._8_4_ = (uint)bVar18 * (int)fVar98 | (uint)!bVar18 * auVar111._8_4_;
              bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
              local_580._12_4_ = (uint)bVar18 * (int)fVar177 | (uint)!bVar18 * auVar111._12_4_;
              bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
              local_580._16_4_ = (uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar111._16_4_;
              bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
              local_580._20_4_ = (uint)bVar18 * (int)fVar148 | (uint)!bVar18 * auVar111._20_4_;
              bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
              local_580._24_4_ = (uint)bVar18 * (int)fVar149 | (uint)!bVar18 * auVar111._24_4_;
              bVar18 = SUB81(uVar89 >> 7,0);
              local_580._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * auVar111._28_4_;
              auVar111 = vsubps_avx(auVar201,auVar56);
              bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
              bVar19 = (bool)((byte)(uVar89 >> 2) & 1);
              bVar20 = (bool)((byte)(uVar89 >> 3) & 1);
              bVar21 = (bool)((byte)(uVar89 >> 4) & 1);
              bVar22 = (bool)((byte)(uVar89 >> 5) & 1);
              bVar23 = (bool)((byte)(uVar89 >> 6) & 1);
              bVar24 = SUB81(uVar89 >> 7,0);
              local_1a0._4_4_ = (uint)bVar18 * (int)fVar192 | (uint)!bVar18 * auVar111._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar88 & 1) * (int)fVar186 | (uint)!(bool)(bVar88 & 1) * auVar111._0_4_;
              local_1a0._8_4_ = (uint)bVar19 * (int)fVar193 | (uint)!bVar19 * auVar111._8_4_;
              local_1a0._12_4_ = (uint)bVar20 * (int)fVar194 | (uint)!bVar20 * auVar111._12_4_;
              local_1a0._16_4_ = (uint)bVar21 * (int)fVar150 | (uint)!bVar21 * auVar111._16_4_;
              local_1a0._20_4_ = (uint)bVar22 * (int)fVar151 | (uint)!bVar22 * auVar111._20_4_;
              local_1a0._24_4_ = (uint)bVar23 * (int)fVar152 | (uint)!bVar23 * auVar111._24_4_;
              local_1a0._28_4_ = (uint)bVar24 * auVar117._28_4_ | (uint)!bVar24 * auVar111._28_4_;
              local_5a0 = auVar110;
              goto LAB_01e72a88;
            }
          }
          bVar96 = 0;
        }
LAB_01e72a88:
        auVar230 = ZEXT3264(local_560);
        auVar229 = ZEXT3264(local_540);
        auVar228 = ZEXT3264(local_520);
        auVar222 = ZEXT3264(auVar116);
        if (bVar96 != 0) {
          auVar111 = vsubps_avx(ZEXT1632(auVar10),auVar107);
          auVar99 = vfmadd213ps_fma(auVar111,local_580,auVar107);
          uVar155 = *(undefined4 *)((long)local_6b8->ray_space + k * 4 + -0x10);
          auVar30._4_4_ = uVar155;
          auVar30._0_4_ = uVar155;
          auVar30._8_4_ = uVar155;
          auVar30._12_4_ = uVar155;
          auVar30._16_4_ = uVar155;
          auVar30._20_4_ = uVar155;
          auVar30._24_4_ = uVar155;
          auVar30._28_4_ = uVar155;
          auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar99._12_4_ + auVar99._12_4_,
                                                        CONCAT48(auVar99._8_4_ + auVar99._8_4_,
                                                                 CONCAT44(auVar99._4_4_ +
                                                                          auVar99._4_4_,
                                                                          auVar99._0_4_ +
                                                                          auVar99._0_4_)))),auVar30)
          ;
          uVar156 = vcmpps_avx512vl(local_5a0,auVar111,6);
          bVar96 = bVar96 & (byte)uVar156;
          if (bVar96 != 0) {
            auVar162._8_4_ = 0xbf800000;
            auVar162._0_8_ = 0xbf800000bf800000;
            auVar162._12_4_ = 0xbf800000;
            auVar162._16_4_ = 0xbf800000;
            auVar162._20_4_ = 0xbf800000;
            auVar162._24_4_ = 0xbf800000;
            auVar162._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_360 = vfmadd132ps_avx512vl(local_1a0,auVar162,auVar31);
            local_1a0 = local_360;
            auVar111 = local_1a0;
            local_320 = 0;
            local_310 = local_6b0._0_8_;
            uStack_308 = local_6b0._8_8_;
            local_300 = local_5f0._0_8_;
            uStack_2f8 = local_5f0._8_8_;
            local_2f0 = local_600._0_8_;
            uStack_2e8 = local_600._8_8_;
            local_2e0 = local_610;
            uStack_2d8 = uStack_608;
            local_1a0 = auVar111;
            if ((pGVar94->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar186 = 1.0 / auVar208._0_4_;
              local_2c0[0] = fVar186 * (local_580._0_4_ + 0.0);
              local_2c0[1] = fVar186 * (local_580._4_4_ + 1.0);
              local_2c0[2] = fVar186 * (local_580._8_4_ + 2.0);
              local_2c0[3] = fVar186 * (local_580._12_4_ + 3.0);
              fStack_2b0 = fVar186 * (local_580._16_4_ + 4.0);
              fStack_2ac = fVar186 * (local_580._20_4_ + 5.0);
              fStack_2a8 = fVar186 * (local_580._24_4_ + 6.0);
              fStack_2a4 = local_580._28_4_ + 7.0;
              local_1a0._0_8_ = local_360._0_8_;
              local_1a0._8_8_ = local_360._8_8_;
              local_1a0._16_8_ = local_360._16_8_;
              local_1a0._24_8_ = local_360._24_8_;
              local_2a0 = local_1a0._0_8_;
              uStack_298 = local_1a0._8_8_;
              uStack_290 = local_1a0._16_8_;
              uStack_288 = local_1a0._24_8_;
              local_280 = local_5a0;
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar111 = vblendmps_avx512vl(auVar163,local_5a0);
              auVar133._0_4_ =
                   (uint)(bVar96 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar96 & 1) * 0x7f800000;
              bVar18 = (bool)(bVar96 >> 1 & 1);
              auVar133._4_4_ = (uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * 0x7f800000;
              bVar18 = (bool)(bVar96 >> 2 & 1);
              auVar133._8_4_ = (uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * 0x7f800000;
              bVar18 = (bool)(bVar96 >> 3 & 1);
              auVar133._12_4_ = (uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * 0x7f800000;
              bVar18 = (bool)(bVar96 >> 4 & 1);
              auVar133._16_4_ = (uint)bVar18 * auVar111._16_4_ | (uint)!bVar18 * 0x7f800000;
              bVar18 = (bool)(bVar96 >> 5 & 1);
              auVar133._20_4_ = (uint)bVar18 * auVar111._20_4_ | (uint)!bVar18 * 0x7f800000;
              bVar18 = (bool)(bVar96 >> 6 & 1);
              auVar133._24_4_ = (uint)bVar18 * auVar111._24_4_ | (uint)!bVar18 * 0x7f800000;
              auVar133._28_4_ =
                   (uint)(bVar96 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar96 >> 7) * 0x7f800000;
              auVar111 = vshufps_avx(auVar133,auVar133,0xb1);
              auVar111 = vminps_avx(auVar133,auVar111);
              auVar110 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar110);
              auVar110 = vpermpd_avx2(auVar111,0x4e);
              auVar111 = vminps_avx(auVar111,auVar110);
              uVar156 = vcmpps_avx512vl(auVar133,auVar111,0);
              bVar87 = (byte)uVar156 & bVar96;
              bVar88 = bVar96;
              if (bVar87 != 0) {
                bVar88 = bVar87;
              }
              uVar26 = 0;
              for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                uVar26 = uVar26 + 1;
              }
              uVar89 = (ulong)uVar26;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar94->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar186 = local_2c0[uVar89];
                uVar155 = *(undefined4 *)((long)&local_2a0 + uVar89 * 4);
                fVar193 = 1.0 - fVar186;
                fVar192 = fVar193 * fVar193 * -3.0;
                auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * fVar193)),
                                          ZEXT416((uint)(fVar186 * fVar193)),ZEXT416(0xc0000000));
                auVar100 = vfmsub132ss_fma(ZEXT416((uint)(fVar186 * fVar193)),
                                           ZEXT416((uint)(fVar186 * fVar186)),ZEXT416(0x40000000));
                fVar193 = auVar99._0_4_ * 3.0;
                fVar194 = auVar100._0_4_ * 3.0;
                fVar178 = fVar186 * fVar186 * 3.0;
                auVar195._0_4_ = fVar178 * (float)local_610._0_4_;
                auVar195._4_4_ = fVar178 * (float)local_610._4_4_;
                auVar195._8_4_ = fVar178 * (float)uStack_608;
                auVar195._12_4_ = fVar178 * uStack_608._4_4_;
                auVar172._4_4_ = fVar194;
                auVar172._0_4_ = fVar194;
                auVar172._8_4_ = fVar194;
                auVar172._12_4_ = fVar194;
                auVar99 = vfmadd132ps_fma(auVar172,auVar195,local_600);
                auVar179._4_4_ = fVar193;
                auVar179._0_4_ = fVar193;
                auVar179._8_4_ = fVar193;
                auVar179._12_4_ = fVar193;
                auVar99 = vfmadd132ps_fma(auVar179,auVar99,local_5f0);
                auVar173._4_4_ = fVar192;
                auVar173._0_4_ = fVar192;
                auVar173._8_4_ = fVar192;
                auVar173._12_4_ = fVar192;
                auVar99 = vfmadd132ps_fma(auVar173,auVar99,local_6b0);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar89 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar99._0_4_;
                uVar14 = vextractps_avx(auVar99,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar14;
                uVar14 = vextractps_avx(auVar99,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                *(float *)(ray + k * 4 + 0xf0) = fVar186;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar155;
                *(uint *)(ray + k * 4 + 0x110) = uVar12;
                *(uint *)(ray + k * 4 + 0x120) = uVar95;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_4d0 = vpbroadcastd_avx512vl();
                local_620 = vpbroadcastd_avx512vl();
                local_4e0 = local_5f0._0_4_;
                uStack_4dc = local_5f0._4_4_;
                uStack_4d8 = local_5f0._8_8_;
                local_4f0 = local_600._0_8_;
                uStack_4e8 = local_600._8_8_;
                local_500 = (float)local_610._0_4_;
                fStack_4fc = (float)local_610._4_4_;
                fStack_4f8 = (float)uStack_608;
                fStack_4f4 = uStack_608._4_4_;
                local_4a0 = fVar187;
                local_480 = auVar116;
                local_380 = local_580;
                local_340 = local_5a0;
                local_31c = iVar13;
                local_2d0 = bVar96;
                do {
                  auVar101 = auVar227._0_16_;
                  local_4c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_220 = local_2c0[uVar89];
                  local_210 = *(undefined4 *)((long)&local_2a0 + uVar89 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar89 * 4);
                  local_698.context = context->user;
                  fVar186 = 1.0 - local_220;
                  fVar154 = fVar186 * fVar186 * -3.0;
                  auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar186 * fVar186)),
                                            ZEXT416((uint)(local_220 * fVar186)),ZEXT416(0xc0000000)
                                           );
                  auVar100 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar186)),
                                             ZEXT416((uint)(local_220 * local_220)),
                                             ZEXT416(0x40000000));
                  fVar186 = auVar99._0_4_ * 3.0;
                  fVar192 = auVar100._0_4_ * 3.0;
                  fVar193 = local_220 * local_220 * 3.0;
                  auVar198._0_4_ = fVar193 * local_500;
                  auVar198._4_4_ = fVar193 * fStack_4fc;
                  auVar198._8_4_ = fVar193 * fStack_4f8;
                  auVar198._12_4_ = fVar193 * fStack_4f4;
                  auVar159._4_4_ = fVar192;
                  auVar159._0_4_ = fVar192;
                  auVar159._8_4_ = fVar192;
                  auVar159._12_4_ = fVar192;
                  auVar83._8_8_ = uStack_4e8;
                  auVar83._0_8_ = local_4f0;
                  auVar99 = vfmadd132ps_fma(auVar159,auVar198,auVar83);
                  auVar182._4_4_ = fVar186;
                  auVar182._0_4_ = fVar186;
                  auVar182._8_4_ = fVar186;
                  auVar182._12_4_ = fVar186;
                  auVar84._4_4_ = uStack_4dc;
                  auVar84._0_4_ = local_4e0;
                  auVar84._8_8_ = uStack_4d8;
                  auVar99 = vfmadd132ps_fma(auVar182,auVar99,auVar84);
                  auVar160._4_4_ = fVar154;
                  auVar160._0_4_ = fVar154;
                  auVar160._8_4_ = fVar154;
                  auVar160._12_4_ = fVar154;
                  auVar99 = vfmadd132ps_fma(auVar160,auVar99,local_6b0);
                  local_250 = auVar99._0_4_;
                  local_240 = vshufps_avx(auVar99,auVar99,0x55);
                  local_230 = vshufps_avx(auVar99,auVar99,0xaa);
                  iStack_24c = local_250;
                  iStack_248 = local_250;
                  iStack_244 = local_250;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  uStack_20c = local_210;
                  uStack_208 = local_210;
                  uStack_204 = local_210;
                  local_200 = local_620._0_8_;
                  uStack_1f8 = local_620._8_8_;
                  local_1f0 = local_4d0;
                  vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                  uStack_1dc = (local_698.context)->instID[0];
                  local_1e0 = uStack_1dc;
                  uStack_1d8 = uStack_1dc;
                  uStack_1d4 = uStack_1dc;
                  uStack_1d0 = (local_698.context)->instPrimID[0];
                  uStack_1cc = uStack_1d0;
                  uStack_1c8 = uStack_1d0;
                  uStack_1c4 = uStack_1d0;
                  local_6d0 = local_3d0._0_8_;
                  uStack_6c8 = local_3d0._8_8_;
                  local_698.valid = (int *)&local_6d0;
                  local_698.geometryUserPtr = pGVar94->userPtr;
                  local_698.hit = (RTCHitN *)&local_250;
                  local_698.N = 4;
                  local_3c0 = (undefined4)uVar89;
                  uStack_3bc = (undefined4)(uVar89 >> 0x20);
                  local_698.ray = (RTCRayN *)ray;
                  if (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar94->intersectionFilterN)(&local_698);
                    uVar89 = CONCAT44(uStack_3bc,local_3c0);
                    auVar216 = ZEXT1664(_local_630);
                    auVar222 = ZEXT3264(local_480);
                    auVar230 = ZEXT3264(local_560);
                    auVar229 = ZEXT3264(local_540);
                    auVar228 = ZEXT3264(local_520);
                    auVar231 = ZEXT3264(local_660);
                    auVar221 = ZEXT3264(local_460);
                    auVar225 = ZEXT3264(local_440);
                    auVar224 = ZEXT3264(local_400);
                    auVar223 = ZEXT3264(local_420);
                    auVar99 = vxorps_avx512vl(auVar101,auVar101);
                    auVar227 = ZEXT1664(auVar99);
                    fVar187 = local_4a0;
                  }
                  auVar99 = auVar227._0_16_;
                  auVar79._8_8_ = uStack_6c8;
                  auVar79._0_8_ = local_6d0;
                  uVar97 = vptestmd_avx512vl(auVar79,auVar79);
                  if ((uVar97 & 0xf) == 0) {
LAB_01e740b4:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_4c0._0_4_;
                  }
                  else {
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar94->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var17)(&local_698);
                      uVar89 = CONCAT44(uStack_3bc,local_3c0);
                      auVar216 = ZEXT1664(_local_630);
                      auVar222 = ZEXT3264(local_480);
                      auVar230 = ZEXT3264(local_560);
                      auVar229 = ZEXT3264(local_540);
                      auVar228 = ZEXT3264(local_520);
                      auVar231 = ZEXT3264(local_660);
                      auVar221 = ZEXT3264(local_460);
                      auVar225 = ZEXT3264(local_440);
                      auVar224 = ZEXT3264(local_400);
                      auVar223 = ZEXT3264(local_420);
                      auVar99 = vxorps_avx512vl(auVar99,auVar99);
                      auVar227 = ZEXT1664(auVar99);
                      fVar187 = local_4a0;
                    }
                    auVar80._8_8_ = uStack_6c8;
                    auVar80._0_8_ = local_6d0;
                    uVar97 = vptestmd_avx512vl(auVar80,auVar80);
                    uVar97 = uVar97 & 0xf;
                    bVar88 = (byte)uVar97;
                    if (bVar88 == 0) goto LAB_01e740b4;
                    iVar1 = *(int *)(local_698.hit + 4);
                    iVar2 = *(int *)(local_698.hit + 8);
                    iVar76 = *(int *)(local_698.hit + 0xc);
                    bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar20 = SUB81(uVar97 >> 3,0);
                    *(uint *)(local_698.ray + 0xc0) =
                         (uint)(bVar88 & 1) * *(int *)local_698.hit |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_698.ray + 0xc0);
                    *(uint *)(local_698.ray + 0xc4) =
                         (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_698.ray + 0xc4);
                    *(uint *)(local_698.ray + 200) =
                         (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_698.ray + 200);
                    *(uint *)(local_698.ray + 0xcc) =
                         (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_698.ray + 0xcc);
                    iVar1 = *(int *)(local_698.hit + 0x14);
                    iVar2 = *(int *)(local_698.hit + 0x18);
                    iVar76 = *(int *)(local_698.hit + 0x1c);
                    bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar20 = SUB81(uVar97 >> 3,0);
                    *(uint *)(local_698.ray + 0xd0) =
                         (uint)(bVar88 & 1) * *(int *)(local_698.hit + 0x10) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_698.ray + 0xd0);
                    *(uint *)(local_698.ray + 0xd4) =
                         (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_698.ray + 0xd4);
                    *(uint *)(local_698.ray + 0xd8) =
                         (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_698.ray + 0xd8);
                    *(uint *)(local_698.ray + 0xdc) =
                         (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_698.ray + 0xdc);
                    iVar1 = *(int *)(local_698.hit + 0x24);
                    iVar2 = *(int *)(local_698.hit + 0x28);
                    iVar76 = *(int *)(local_698.hit + 0x2c);
                    bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar20 = SUB81(uVar97 >> 3,0);
                    *(uint *)(local_698.ray + 0xe0) =
                         (uint)(bVar88 & 1) * *(int *)(local_698.hit + 0x20) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_698.ray + 0xe0);
                    *(uint *)(local_698.ray + 0xe4) =
                         (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_698.ray + 0xe4);
                    *(uint *)(local_698.ray + 0xe8) =
                         (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_698.ray + 0xe8);
                    *(uint *)(local_698.ray + 0xec) =
                         (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_698.ray + 0xec);
                    iVar1 = *(int *)(local_698.hit + 0x34);
                    iVar2 = *(int *)(local_698.hit + 0x38);
                    iVar76 = *(int *)(local_698.hit + 0x3c);
                    bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar20 = SUB81(uVar97 >> 3,0);
                    *(uint *)(local_698.ray + 0xf0) =
                         (uint)(bVar88 & 1) * *(int *)(local_698.hit + 0x30) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_698.ray + 0xf0);
                    *(uint *)(local_698.ray + 0xf4) =
                         (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_698.ray + 0xf4);
                    *(uint *)(local_698.ray + 0xf8) =
                         (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_698.ray + 0xf8);
                    *(uint *)(local_698.ray + 0xfc) =
                         (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_698.ray + 0xfc);
                    auVar99 = *(undefined1 (*) [16])(local_698.ray + 0x100);
                    auVar106._0_4_ =
                         (uint)(bVar88 & 1) * *(int *)(local_698.hit + 0x40) |
                         (uint)!(bool)(bVar88 & 1) * auVar99._0_4_;
                    bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar106._4_4_ =
                         (uint)bVar18 * *(int *)(local_698.hit + 0x44) |
                         (uint)!bVar18 * auVar99._4_4_;
                    bVar18 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar106._8_4_ =
                         (uint)bVar18 * *(int *)(local_698.hit + 0x48) |
                         (uint)!bVar18 * auVar99._8_4_;
                    bVar18 = SUB81(uVar97 >> 3,0);
                    auVar106._12_4_ =
                         (uint)bVar18 * *(int *)(local_698.hit + 0x4c) |
                         (uint)!bVar18 * auVar99._12_4_;
                    *(undefined1 (*) [16])(local_698.ray + 0x100) = auVar106;
                    auVar99 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x50));
                    *(undefined1 (*) [16])(local_698.ray + 0x110) = auVar99;
                    auVar99 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x60));
                    *(undefined1 (*) [16])(local_698.ray + 0x120) = auVar99;
                    auVar99 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x70));
                    *(undefined1 (*) [16])(local_698.ray + 0x130) = auVar99;
                    auVar99 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x80));
                    *(undefined1 (*) [16])(local_698.ray + 0x140) = auVar99;
                  }
                  auVar116 = auVar222._0_32_;
                  bVar88 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & bVar96;
                  uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar38._4_4_ = uVar155;
                  auVar38._0_4_ = uVar155;
                  auVar38._8_4_ = uVar155;
                  auVar38._12_4_ = uVar155;
                  auVar38._16_4_ = uVar155;
                  auVar38._20_4_ = uVar155;
                  auVar38._24_4_ = uVar155;
                  auVar38._28_4_ = uVar155;
                  uVar156 = vcmpps_avx512vl(local_5a0,auVar38,2);
                  bVar96 = bVar88 & (byte)uVar156;
                  if ((bVar88 & (byte)uVar156) != 0) {
                    auVar167._8_4_ = 0x7f800000;
                    auVar167._0_8_ = 0x7f8000007f800000;
                    auVar167._12_4_ = 0x7f800000;
                    auVar167._16_4_ = 0x7f800000;
                    auVar167._20_4_ = 0x7f800000;
                    auVar167._24_4_ = 0x7f800000;
                    auVar167._28_4_ = 0x7f800000;
                    auVar111 = vblendmps_avx512vl(auVar167,local_5a0);
                    auVar146._0_4_ =
                         (uint)(bVar96 & 1) * auVar111._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * 0x7f800000;
                    bVar18 = (bool)(bVar96 >> 1 & 1);
                    auVar146._4_4_ = (uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar96 >> 2 & 1);
                    auVar146._8_4_ = (uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar96 >> 3 & 1);
                    auVar146._12_4_ = (uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar96 >> 4 & 1);
                    auVar146._16_4_ = (uint)bVar18 * auVar111._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar96 >> 5 & 1);
                    auVar146._20_4_ = (uint)bVar18 * auVar111._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar96 >> 6 & 1);
                    auVar146._24_4_ = (uint)bVar18 * auVar111._24_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar146._28_4_ =
                         (uint)(bVar96 >> 7) * auVar111._28_4_ |
                         (uint)!(bool)(bVar96 >> 7) * 0x7f800000;
                    auVar111 = vshufps_avx(auVar146,auVar146,0xb1);
                    auVar111 = vminps_avx(auVar146,auVar111);
                    auVar110 = vshufpd_avx(auVar111,auVar111,5);
                    auVar111 = vminps_avx(auVar111,auVar110);
                    auVar110 = vpermpd_avx2(auVar111,0x4e);
                    auVar111 = vminps_avx(auVar111,auVar110);
                    uVar156 = vcmpps_avx512vl(auVar146,auVar111,0);
                    bVar87 = (byte)uVar156 & bVar96;
                    bVar88 = bVar96;
                    if (bVar87 != 0) {
                      bVar88 = bVar87;
                    }
                    uVar26 = 0;
                    for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000
                        ) {
                      uVar26 = uVar26 + 1;
                    }
                    uVar89 = (ulong)uVar26;
                  }
                  fVar154 = auVar216._0_4_;
                } while (bVar96 != 0);
              }
            }
          }
        }
      }
      local_4a0 = fVar154;
      if (8 < iVar13) {
        auVar111 = vpbroadcastd_avx512vl();
        auVar216 = ZEXT3264(auVar111);
        fStack_390 = 1.0 / (float)local_3a0._0_4_;
        local_3a0._4_4_ = fStack_390;
        local_3a0._0_4_ = fStack_390;
        fStack_398 = fStack_390;
        fStack_394 = fStack_390;
        local_4c0 = vpbroadcastd_avx512vl();
        local_4d0 = vpbroadcastd_avx512vl();
        lVar92 = 8;
        fStack_49c = local_4a0;
        fStack_498 = local_4a0;
        fStack_494 = local_4a0;
        fStack_490 = local_4a0;
        fStack_48c = local_4a0;
        fStack_488 = local_4a0;
        fStack_484 = local_4a0;
        local_480 = auVar116;
        local_3c0 = fVar187;
        uStack_3bc = fVar187;
        uStack_3b8 = fVar187;
        uStack_3b4 = fVar187;
        uStack_3b0 = fVar187;
        uStack_3ac = fVar187;
        uStack_3a8 = fVar187;
        uStack_3a4 = fVar187;
        fStack_38c = fStack_390;
        fStack_388 = fStack_390;
        fStack_384 = fStack_390;
        do {
          auVar111 = vpbroadcastd_avx512vl();
          auVar112 = vpor_avx2(auVar111,_DAT_0205a920);
          uVar25 = vpcmpgtd_avx512vl(auVar216._0_32_,auVar112);
          auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 * 4 + lVar27);
          auVar110 = *(undefined1 (*) [32])(lVar27 + 0x2227768 + lVar92 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar27 + 0x2227bec + lVar92 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar27 + 0x2228070 + lVar92 * 4);
          local_540 = auVar229._0_32_;
          auVar113 = vmulps_avx512vl(local_540,auVar121);
          local_560 = auVar230._0_32_;
          auVar120 = vmulps_avx512vl(local_560,auVar121);
          auVar57._4_4_ = auVar121._4_4_ * (float)local_100._4_4_;
          auVar57._0_4_ = auVar121._0_4_ * (float)local_100._0_4_;
          auVar57._8_4_ = auVar121._8_4_ * fStack_f8;
          auVar57._12_4_ = auVar121._12_4_ * fStack_f4;
          auVar57._16_4_ = auVar121._16_4_ * fStack_f0;
          auVar57._20_4_ = auVar121._20_4_ * fStack_ec;
          auVar57._24_4_ = auVar121._24_4_ * fStack_e8;
          auVar57._28_4_ = auVar112._28_4_;
          auVar200 = auVar231._0_32_;
          auVar112 = vfmadd231ps_avx512vl(auVar113,auVar122,auVar200);
          local_520 = auVar228._0_32_;
          auVar113 = vfmadd231ps_avx512vl(auVar120,auVar122,local_520);
          auVar120 = vfmadd231ps_avx512vl(auVar57,auVar122,local_e0);
          auVar199 = auVar225._0_32_;
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,auVar199);
          auVar169 = auVar221._0_32_;
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar169);
          auVar99 = vfmadd231ps_fma(auVar120,auVar110,local_c0);
          auVar176 = auVar223._0_32_;
          auVar109 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar176);
          local_400 = auVar224._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar113,auVar111,local_400);
          auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 * 4 + lVar27);
          auVar113 = *(undefined1 (*) [32])(lVar27 + 0x2229b88 + lVar92 * 4);
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar111,local_a0);
          auVar120 = *(undefined1 (*) [32])(lVar27 + 0x222a00c + lVar92 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar27 + 0x222a490 + lVar92 * 4);
          auVar116 = vmulps_avx512vl(local_540,auVar114);
          auVar115 = vmulps_avx512vl(local_560,auVar114);
          auVar58._4_4_ = auVar114._4_4_ * (float)local_100._4_4_;
          auVar58._0_4_ = auVar114._0_4_ * (float)local_100._0_4_;
          auVar58._8_4_ = auVar114._8_4_ * fStack_f8;
          auVar58._12_4_ = auVar114._12_4_ * fStack_f4;
          auVar58._16_4_ = auVar114._16_4_ * fStack_f0;
          auVar58._20_4_ = auVar114._20_4_ * fStack_ec;
          auVar58._24_4_ = auVar114._24_4_ * fStack_e8;
          auVar58._28_4_ = uStack_e4;
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar120,auVar200);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar120,local_520);
          auVar118 = vfmadd231ps_avx512vl(auVar58,auVar120,local_e0);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar113,auVar199);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar169);
          auVar100 = vfmadd231ps_fma(auVar118,auVar113,local_c0);
          auVar118 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar176);
          auVar107 = vfmadd231ps_avx512vl(auVar115,auVar112,local_400);
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar112,local_a0);
          auVar108 = vmaxps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar100));
          auVar116 = vsubps_avx(auVar118,auVar109);
          auVar115 = vsubps_avx(auVar107,auVar117);
          auVar119 = vmulps_avx512vl(auVar117,auVar116);
          auVar134 = vmulps_avx512vl(auVar109,auVar115);
          auVar119 = vsubps_avx512vl(auVar119,auVar134);
          auVar134 = vmulps_avx512vl(auVar115,auVar115);
          auVar134 = vfmadd231ps_avx512vl(auVar134,auVar116,auVar116);
          auVar108 = vmulps_avx512vl(auVar108,auVar108);
          auVar108 = vmulps_avx512vl(auVar108,auVar134);
          auVar119 = vmulps_avx512vl(auVar119,auVar119);
          uVar156 = vcmpps_avx512vl(auVar119,auVar108,2);
          local_2d0 = (byte)uVar25 & (byte)uVar156;
          if (local_2d0 == 0) {
            auVar222 = ZEXT3264(auVar169);
            auVar231 = ZEXT3264(auVar200);
          }
          else {
            auVar114 = vmulps_avx512vl(local_480,auVar114);
            auVar120 = vfmadd213ps_avx512vl(auVar120,local_160,auVar114);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_140,auVar120);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_120,auVar113);
            auVar121 = vmulps_avx512vl(local_480,auVar121);
            auVar122 = vfmadd213ps_avx512vl(auVar122,local_160,auVar121);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar122);
            auVar113 = vfmadd213ps_avx512vl(auVar111,local_120,auVar110);
            auVar111 = *(undefined1 (*) [32])(lVar27 + 0x22284f4 + lVar92 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar27 + 0x2228978 + lVar92 * 4);
            auVar122 = *(undefined1 (*) [32])(lVar27 + 0x2228dfc + lVar92 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar27 + 0x2229280 + lVar92 * 4);
            auVar120 = vmulps_avx512vl(local_540,auVar121);
            auVar114 = vmulps_avx512vl(local_560,auVar121);
            auVar121 = vmulps_avx512vl(local_480,auVar121);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar122,auVar200);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,local_520);
            auVar122 = vfmadd231ps_avx512vl(auVar121,local_160,auVar122);
            auVar121 = vfmadd231ps_avx512vl(auVar120,auVar110,auVar199);
            auVar120 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar169);
            auVar110 = vfmadd231ps_avx512vl(auVar122,local_140,auVar110);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar111,auVar176);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar111,local_400);
            auVar114 = vfmadd231ps_avx512vl(auVar110,local_120,auVar111);
            auVar111 = *(undefined1 (*) [32])(lVar27 + 0x222a914 + lVar92 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar27 + 0x222b21c + lVar92 * 4);
            auVar122 = *(undefined1 (*) [32])(lVar27 + 0x222b6a0 + lVar92 * 4);
            auVar108 = vmulps_avx512vl(local_540,auVar122);
            auVar119 = vmulps_avx512vl(local_560,auVar122);
            auVar122 = vmulps_avx512vl(local_480,auVar122);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar200);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar110,local_520);
            auVar122 = vfmadd231ps_avx512vl(auVar122,local_160,auVar110);
            auVar110 = *(undefined1 (*) [32])(lVar27 + 0x222ad98 + lVar92 * 4);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar199);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar110,auVar169);
            auVar110 = vfmadd231ps_avx512vl(auVar122,local_140,auVar110);
            auVar122 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar176);
            auVar108 = vfmadd231ps_avx512vl(auVar119,auVar111,local_400);
            auVar110 = vfmadd231ps_avx512vl(auVar110,local_120,auVar111);
            auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar121,auVar119);
            vandps_avx512vl(auVar120,auVar119);
            auVar111 = vmaxps_avx(auVar119,auVar119);
            vandps_avx512vl(auVar114,auVar119);
            auVar111 = vmaxps_avx(auVar111,auVar119);
            auVar85._4_4_ = fStack_49c;
            auVar85._0_4_ = local_4a0;
            auVar85._8_4_ = fStack_498;
            auVar85._12_4_ = fStack_494;
            auVar85._16_4_ = fStack_490;
            auVar85._20_4_ = fStack_48c;
            auVar85._24_4_ = fStack_488;
            auVar85._28_4_ = fStack_484;
            uVar89 = vcmpps_avx512vl(auVar111,auVar85,1);
            bVar18 = (bool)((byte)uVar89 & 1);
            auVar135._0_4_ = (float)((uint)bVar18 * auVar116._0_4_ | (uint)!bVar18 * auVar121._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar18 * auVar116._4_4_ | (uint)!bVar18 * auVar121._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar18 * auVar116._8_4_ | (uint)!bVar18 * auVar121._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar18 * auVar116._12_4_ | (uint)!bVar18 * auVar121._12_4_);
            bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar135._16_4_ =
                 (float)((uint)bVar18 * auVar116._16_4_ | (uint)!bVar18 * auVar121._16_4_);
            bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar135._20_4_ =
                 (float)((uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * auVar121._20_4_);
            bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar135._24_4_ =
                 (float)((uint)bVar18 * auVar116._24_4_ | (uint)!bVar18 * auVar121._24_4_);
            bVar18 = SUB81(uVar89 >> 7,0);
            auVar135._28_4_ = (uint)bVar18 * auVar116._28_4_ | (uint)!bVar18 * auVar121._28_4_;
            bVar18 = (bool)((byte)uVar89 & 1);
            auVar136._0_4_ = (float)((uint)bVar18 * auVar115._0_4_ | (uint)!bVar18 * auVar120._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar18 * auVar115._4_4_ | (uint)!bVar18 * auVar120._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar18 * auVar115._8_4_ | (uint)!bVar18 * auVar120._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar18 * auVar115._12_4_ | (uint)!bVar18 * auVar120._12_4_);
            bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar136._16_4_ =
                 (float)((uint)bVar18 * auVar115._16_4_ | (uint)!bVar18 * auVar120._16_4_);
            bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar136._20_4_ =
                 (float)((uint)bVar18 * auVar115._20_4_ | (uint)!bVar18 * auVar120._20_4_);
            bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar136._24_4_ =
                 (float)((uint)bVar18 * auVar115._24_4_ | (uint)!bVar18 * auVar120._24_4_);
            bVar18 = SUB81(uVar89 >> 7,0);
            auVar136._28_4_ = (uint)bVar18 * auVar115._28_4_ | (uint)!bVar18 * auVar120._28_4_;
            vandps_avx512vl(auVar122,auVar119);
            vandps_avx512vl(auVar108,auVar119);
            auVar111 = vmaxps_avx(auVar136,auVar136);
            vandps_avx512vl(auVar110,auVar119);
            auVar111 = vmaxps_avx(auVar111,auVar136);
            uVar89 = vcmpps_avx512vl(auVar111,auVar85,1);
            bVar18 = (bool)((byte)uVar89 & 1);
            auVar137._0_4_ = (uint)bVar18 * auVar116._0_4_ | (uint)!bVar18 * auVar122._0_4_;
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar18 * auVar116._4_4_ | (uint)!bVar18 * auVar122._4_4_;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar18 * auVar116._8_4_ | (uint)!bVar18 * auVar122._8_4_;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar18 * auVar116._12_4_ | (uint)!bVar18 * auVar122._12_4_;
            bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar137._16_4_ = (uint)bVar18 * auVar116._16_4_ | (uint)!bVar18 * auVar122._16_4_;
            bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar137._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * auVar122._20_4_;
            bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar137._24_4_ = (uint)bVar18 * auVar116._24_4_ | (uint)!bVar18 * auVar122._24_4_;
            bVar18 = SUB81(uVar89 >> 7,0);
            auVar137._28_4_ = (uint)bVar18 * auVar116._28_4_ | (uint)!bVar18 * auVar122._28_4_;
            bVar18 = (bool)((byte)uVar89 & 1);
            auVar138._0_4_ = (float)((uint)bVar18 * auVar115._0_4_ | (uint)!bVar18 * auVar108._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar18 * auVar115._4_4_ | (uint)!bVar18 * auVar108._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar18 * auVar115._8_4_ | (uint)!bVar18 * auVar108._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar18 * auVar115._12_4_ | (uint)!bVar18 * auVar108._12_4_);
            bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar138._16_4_ =
                 (float)((uint)bVar18 * auVar115._16_4_ | (uint)!bVar18 * auVar108._16_4_);
            bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar138._20_4_ =
                 (float)((uint)bVar18 * auVar115._20_4_ | (uint)!bVar18 * auVar108._20_4_);
            bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar138._24_4_ =
                 (float)((uint)bVar18 * auVar115._24_4_ | (uint)!bVar18 * auVar108._24_4_);
            bVar18 = SUB81(uVar89 >> 7,0);
            auVar138._28_4_ = (uint)bVar18 * auVar115._28_4_ | (uint)!bVar18 * auVar108._28_4_;
            auVar210._8_4_ = 0x80000000;
            auVar210._0_8_ = 0x8000000080000000;
            auVar210._12_4_ = 0x80000000;
            auVar210._16_4_ = 0x80000000;
            auVar210._20_4_ = 0x80000000;
            auVar210._24_4_ = 0x80000000;
            auVar210._28_4_ = 0x80000000;
            auVar111 = vxorps_avx512vl(auVar137,auVar210);
            auVar108 = auVar227._0_32_;
            auVar110 = vfmadd213ps_avx512vl(auVar135,auVar135,auVar108);
            auVar101 = vfmadd231ps_fma(auVar110,auVar136,auVar136);
            auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
            auVar220._8_4_ = 0xbf000000;
            auVar220._0_8_ = 0xbf000000bf000000;
            auVar220._12_4_ = 0xbf000000;
            auVar220._16_4_ = 0xbf000000;
            auVar220._20_4_ = 0xbf000000;
            auVar220._24_4_ = 0xbf000000;
            auVar220._28_4_ = 0xbf000000;
            fVar187 = auVar110._0_4_;
            fVar154 = auVar110._4_4_;
            fVar186 = auVar110._8_4_;
            fVar192 = auVar110._12_4_;
            fVar193 = auVar110._16_4_;
            fVar194 = auVar110._20_4_;
            fVar178 = auVar110._24_4_;
            auVar59._4_4_ = fVar154 * fVar154 * fVar154 * auVar101._4_4_ * -0.5;
            auVar59._0_4_ = fVar187 * fVar187 * fVar187 * auVar101._0_4_ * -0.5;
            auVar59._8_4_ = fVar186 * fVar186 * fVar186 * auVar101._8_4_ * -0.5;
            auVar59._12_4_ = fVar192 * fVar192 * fVar192 * auVar101._12_4_ * -0.5;
            auVar59._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
            auVar59._20_4_ = fVar194 * fVar194 * fVar194 * -0.0;
            auVar59._24_4_ = fVar178 * fVar178 * fVar178 * -0.0;
            auVar59._28_4_ = auVar136._28_4_;
            auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar110 = vfmadd231ps_avx512vl(auVar59,auVar122,auVar110);
            auVar60._4_4_ = auVar136._4_4_ * auVar110._4_4_;
            auVar60._0_4_ = auVar136._0_4_ * auVar110._0_4_;
            auVar60._8_4_ = auVar136._8_4_ * auVar110._8_4_;
            auVar60._12_4_ = auVar136._12_4_ * auVar110._12_4_;
            auVar60._16_4_ = auVar136._16_4_ * auVar110._16_4_;
            auVar60._20_4_ = auVar136._20_4_ * auVar110._20_4_;
            auVar60._24_4_ = auVar136._24_4_ * auVar110._24_4_;
            auVar60._28_4_ = 0;
            auVar61._4_4_ = auVar110._4_4_ * -auVar135._4_4_;
            auVar61._0_4_ = auVar110._0_4_ * -auVar135._0_4_;
            auVar61._8_4_ = auVar110._8_4_ * -auVar135._8_4_;
            auVar61._12_4_ = auVar110._12_4_ * -auVar135._12_4_;
            auVar61._16_4_ = auVar110._16_4_ * -auVar135._16_4_;
            auVar61._20_4_ = auVar110._20_4_ * -auVar135._20_4_;
            auVar61._24_4_ = auVar110._24_4_ * -auVar135._24_4_;
            auVar61._28_4_ = auVar136._28_4_;
            auVar121 = vmulps_avx512vl(auVar110,auVar108);
            auVar110 = vfmadd213ps_avx512vl(auVar137,auVar137,auVar108);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar138,auVar138);
            auVar120 = vrsqrt14ps_avx512vl(auVar110);
            auVar110 = vmulps_avx512vl(auVar110,auVar220);
            fVar187 = auVar120._0_4_;
            fVar154 = auVar120._4_4_;
            fVar186 = auVar120._8_4_;
            fVar192 = auVar120._12_4_;
            fVar193 = auVar120._16_4_;
            fVar194 = auVar120._20_4_;
            fVar178 = auVar120._24_4_;
            auVar62._4_4_ = fVar154 * fVar154 * fVar154 * auVar110._4_4_;
            auVar62._0_4_ = fVar187 * fVar187 * fVar187 * auVar110._0_4_;
            auVar62._8_4_ = fVar186 * fVar186 * fVar186 * auVar110._8_4_;
            auVar62._12_4_ = fVar192 * fVar192 * fVar192 * auVar110._12_4_;
            auVar62._16_4_ = fVar193 * fVar193 * fVar193 * auVar110._16_4_;
            auVar62._20_4_ = fVar194 * fVar194 * fVar194 * auVar110._20_4_;
            auVar62._24_4_ = fVar178 * fVar178 * fVar178 * auVar110._24_4_;
            auVar62._28_4_ = auVar110._28_4_;
            auVar110 = vfmadd231ps_avx512vl(auVar62,auVar122,auVar120);
            auVar63._4_4_ = auVar138._4_4_ * auVar110._4_4_;
            auVar63._0_4_ = auVar138._0_4_ * auVar110._0_4_;
            auVar63._8_4_ = auVar138._8_4_ * auVar110._8_4_;
            auVar63._12_4_ = auVar138._12_4_ * auVar110._12_4_;
            auVar63._16_4_ = auVar138._16_4_ * auVar110._16_4_;
            auVar63._20_4_ = auVar138._20_4_ * auVar110._20_4_;
            auVar63._24_4_ = auVar138._24_4_ * auVar110._24_4_;
            auVar63._28_4_ = auVar120._28_4_;
            auVar64._4_4_ = auVar110._4_4_ * auVar111._4_4_;
            auVar64._0_4_ = auVar110._0_4_ * auVar111._0_4_;
            auVar64._8_4_ = auVar110._8_4_ * auVar111._8_4_;
            auVar64._12_4_ = auVar110._12_4_ * auVar111._12_4_;
            auVar64._16_4_ = auVar110._16_4_ * auVar111._16_4_;
            auVar64._20_4_ = auVar110._20_4_ * auVar111._20_4_;
            auVar64._24_4_ = auVar110._24_4_ * auVar111._24_4_;
            auVar64._28_4_ = auVar111._28_4_;
            auVar111 = vmulps_avx512vl(auVar110,auVar108);
            auVar101 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar99),auVar109);
            auVar110 = ZEXT1632(auVar99);
            auVar226 = vfmadd213ps_fma(auVar61,auVar110,auVar117);
            auVar122 = vfmadd213ps_avx512vl(auVar121,auVar110,auVar113);
            auVar120 = vfmadd213ps_avx512vl(auVar63,ZEXT1632(auVar100),auVar118);
            auVar10 = vfnmadd213ps_fma(auVar60,auVar110,auVar109);
            auVar114 = ZEXT1632(auVar100);
            auVar6 = vfmadd213ps_fma(auVar64,auVar114,auVar107);
            auVar102 = vfnmadd213ps_fma(auVar61,auVar110,auVar117);
            auVar7 = vfmadd213ps_fma(auVar111,auVar114,auVar112);
            auVar117 = ZEXT1632(auVar99);
            auVar104 = vfnmadd231ps_fma(auVar113,auVar117,auVar121);
            auVar103 = vfnmadd213ps_fma(auVar63,auVar114,auVar118);
            auVar168 = vfnmadd213ps_fma(auVar64,auVar114,auVar107);
            auVar170 = vfnmadd231ps_fma(auVar112,ZEXT1632(auVar100),auVar111);
            auVar112 = vsubps_avx512vl(auVar120,ZEXT1632(auVar10));
            auVar111 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar102));
            auVar110 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar104));
            auVar65._4_4_ = auVar111._4_4_ * auVar104._4_4_;
            auVar65._0_4_ = auVar111._0_4_ * auVar104._0_4_;
            auVar65._8_4_ = auVar111._8_4_ * auVar104._8_4_;
            auVar65._12_4_ = auVar111._12_4_ * auVar104._12_4_;
            auVar65._16_4_ = auVar111._16_4_ * 0.0;
            auVar65._20_4_ = auVar111._20_4_ * 0.0;
            auVar65._24_4_ = auVar111._24_4_ * 0.0;
            auVar65._28_4_ = auVar121._28_4_;
            auVar99 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar102),auVar110);
            auVar66._4_4_ = auVar110._4_4_ * auVar10._4_4_;
            auVar66._0_4_ = auVar110._0_4_ * auVar10._0_4_;
            auVar66._8_4_ = auVar110._8_4_ * auVar10._8_4_;
            auVar66._12_4_ = auVar110._12_4_ * auVar10._12_4_;
            auVar66._16_4_ = auVar110._16_4_ * 0.0;
            auVar66._20_4_ = auVar110._20_4_ * 0.0;
            auVar66._24_4_ = auVar110._24_4_ * 0.0;
            auVar66._28_4_ = auVar110._28_4_;
            auVar8 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar104),auVar112);
            auVar67._4_4_ = auVar102._4_4_ * auVar112._4_4_;
            auVar67._0_4_ = auVar102._0_4_ * auVar112._0_4_;
            auVar67._8_4_ = auVar102._8_4_ * auVar112._8_4_;
            auVar67._12_4_ = auVar102._12_4_ * auVar112._12_4_;
            auVar67._16_4_ = auVar112._16_4_ * 0.0;
            auVar67._20_4_ = auVar112._20_4_ * 0.0;
            auVar67._24_4_ = auVar112._24_4_ * 0.0;
            auVar67._28_4_ = auVar112._28_4_;
            auVar9 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar10),auVar111);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar108,ZEXT1632(auVar8));
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,ZEXT1632(auVar99));
            uVar89 = vcmpps_avx512vl(auVar111,auVar108,2);
            bVar96 = (byte)uVar89;
            fVar177 = (float)((uint)(bVar96 & 1) * auVar101._0_4_ |
                             (uint)!(bool)(bVar96 & 1) * auVar103._0_4_);
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar148 = (float)((uint)bVar18 * auVar101._4_4_ | (uint)!bVar18 * auVar103._4_4_);
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar150 = (float)((uint)bVar18 * auVar101._8_4_ | (uint)!bVar18 * auVar103._8_4_);
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar152 = (float)((uint)bVar18 * auVar101._12_4_ | (uint)!bVar18 * auVar103._12_4_);
            auVar114 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar177))));
            fVar147 = (float)((uint)(bVar96 & 1) * auVar226._0_4_ |
                             (uint)!(bool)(bVar96 & 1) * auVar168._0_4_);
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar149 = (float)((uint)bVar18 * auVar226._4_4_ | (uint)!bVar18 * auVar168._4_4_);
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar151 = (float)((uint)bVar18 * auVar226._8_4_ | (uint)!bVar18 * auVar168._8_4_);
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar153 = (float)((uint)bVar18 * auVar226._12_4_ | (uint)!bVar18 * auVar168._12_4_);
            auVar116 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar147))));
            auVar139._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar122._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar170._0_4_);
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar170._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar170._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar170._12_4_);
            fVar187 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar122._16_4_);
            auVar139._16_4_ = fVar187;
            fVar154 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar122._20_4_);
            auVar139._20_4_ = fVar154;
            fVar186 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar122._24_4_);
            auVar139._24_4_ = fVar186;
            iVar1 = (uint)(byte)(uVar89 >> 7) * auVar122._28_4_;
            auVar139._28_4_ = iVar1;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar120);
            auVar140._0_4_ =
                 (uint)(bVar96 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar99._0_4_;
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * auVar99._4_4_;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * auVar99._8_4_;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * auVar99._12_4_;
            auVar140._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar111._16_4_;
            auVar140._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar111._20_4_;
            auVar140._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar111._24_4_;
            auVar140._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar111._28_4_;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar6));
            auVar141._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar101._0_4_);
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar141._4_4_ = (float)((uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * auVar101._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar141._8_4_ = (float)((uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * auVar101._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar141._12_4_ =
                 (float)((uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * auVar101._12_4_);
            fVar193 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar111._16_4_);
            auVar141._16_4_ = fVar193;
            fVar194 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar111._20_4_);
            auVar141._20_4_ = fVar194;
            fVar192 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar111._24_4_);
            auVar141._24_4_ = fVar192;
            auVar141._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar111._28_4_;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar7));
            auVar142._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar226._0_4_);
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * auVar226._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * auVar226._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * auVar226._12_4_);
            fVar98 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar111._16_4_);
            auVar142._16_4_ = fVar98;
            fVar178 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar111._20_4_);
            auVar142._20_4_ = fVar178;
            fVar185 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar111._24_4_);
            auVar142._24_4_ = fVar185;
            iVar2 = (uint)(byte)(uVar89 >> 7) * auVar111._28_4_;
            auVar142._28_4_ = iVar2;
            auVar143._0_4_ =
                 (uint)(bVar96 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar96 & 1) * auVar120._0_4_;
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar18 * (int)auVar10._4_4_ | (uint)!bVar18 * auVar120._4_4_;
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar18 * (int)auVar10._8_4_ | (uint)!bVar18 * auVar120._8_4_;
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar18 * (int)auVar10._12_4_ | (uint)!bVar18 * auVar120._12_4_;
            auVar143._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar120._16_4_;
            auVar143._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar120._20_4_;
            auVar143._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar120._24_4_;
            auVar143._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar120._28_4_;
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar89 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar120 = vsubps_avx512vl(auVar143,auVar114);
            auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar102._12_4_ |
                                                     (uint)!bVar22 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar102._8_4_ |
                                                              (uint)!bVar20 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar102._4_4_ |
                                                                       (uint)!bVar18 * auVar6._4_4_,
                                                                       (uint)(bVar96 & 1) *
                                                                       (int)auVar102._0_4_ |
                                                                       (uint)!(bool)(bVar96 & 1) *
                                                                       auVar6._0_4_)))),auVar116);
            auVar122 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar104._12_4_ |
                                                     (uint)!bVar23 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar21 * (int)auVar104._8_4_ |
                                                              (uint)!bVar21 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar19 *
                                                                       (int)auVar104._4_4_ |
                                                                       (uint)!bVar19 * auVar7._4_4_,
                                                                       (uint)(bVar96 & 1) *
                                                                       (int)auVar104._0_4_ |
                                                                       (uint)!(bool)(bVar96 & 1) *
                                                                       auVar7._0_4_)))),auVar139);
            auVar121 = vsubps_avx(auVar114,auVar140);
            auVar112 = vsubps_avx(auVar116,auVar141);
            auVar113 = vsubps_avx(auVar139,auVar142);
            auVar68._4_4_ = auVar122._4_4_ * fVar148;
            auVar68._0_4_ = auVar122._0_4_ * fVar177;
            auVar68._8_4_ = auVar122._8_4_ * fVar150;
            auVar68._12_4_ = auVar122._12_4_ * fVar152;
            auVar68._16_4_ = auVar122._16_4_ * 0.0;
            auVar68._20_4_ = auVar122._20_4_ * 0.0;
            auVar68._24_4_ = auVar122._24_4_ * 0.0;
            auVar68._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar68,auVar139,auVar120);
            auVar184._0_4_ = fVar147 * auVar120._0_4_;
            auVar184._4_4_ = fVar149 * auVar120._4_4_;
            auVar184._8_4_ = fVar151 * auVar120._8_4_;
            auVar184._12_4_ = fVar153 * auVar120._12_4_;
            auVar184._16_4_ = auVar120._16_4_ * 0.0;
            auVar184._20_4_ = auVar120._20_4_ * 0.0;
            auVar184._24_4_ = auVar120._24_4_ * 0.0;
            auVar184._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar184,auVar114,auVar110);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar108,ZEXT1632(auVar99));
            auVar190._0_4_ = auVar110._0_4_ * auVar139._0_4_;
            auVar190._4_4_ = auVar110._4_4_ * auVar139._4_4_;
            auVar190._8_4_ = auVar110._8_4_ * auVar139._8_4_;
            auVar190._12_4_ = auVar110._12_4_ * auVar139._12_4_;
            auVar190._16_4_ = auVar110._16_4_ * fVar187;
            auVar190._20_4_ = auVar110._20_4_ * fVar154;
            auVar190._24_4_ = auVar110._24_4_ * fVar186;
            auVar190._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar190,auVar116,auVar122);
            auVar115 = vfmadd231ps_avx512vl(auVar111,auVar108,ZEXT1632(auVar99));
            auVar111 = vmulps_avx512vl(auVar113,auVar140);
            auVar111 = vfmsub231ps_avx512vl(auVar111,auVar121,auVar142);
            auVar69._4_4_ = auVar112._4_4_ * auVar142._4_4_;
            auVar69._0_4_ = auVar112._0_4_ * auVar142._0_4_;
            auVar69._8_4_ = auVar112._8_4_ * auVar142._8_4_;
            auVar69._12_4_ = auVar112._12_4_ * auVar142._12_4_;
            auVar69._16_4_ = auVar112._16_4_ * fVar98;
            auVar69._20_4_ = auVar112._20_4_ * fVar178;
            auVar69._24_4_ = auVar112._24_4_ * fVar185;
            auVar69._28_4_ = iVar2;
            auVar99 = vfmsub231ps_fma(auVar69,auVar141,auVar113);
            auVar191._0_4_ = auVar141._0_4_ * auVar121._0_4_;
            auVar191._4_4_ = auVar141._4_4_ * auVar121._4_4_;
            auVar191._8_4_ = auVar141._8_4_ * auVar121._8_4_;
            auVar191._12_4_ = auVar141._12_4_ * auVar121._12_4_;
            auVar191._16_4_ = fVar193 * auVar121._16_4_;
            auVar191._20_4_ = fVar194 * auVar121._20_4_;
            auVar191._24_4_ = fVar192 * auVar121._24_4_;
            auVar191._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar191,auVar112,auVar140);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar108,auVar111);
            auVar109 = vfmadd231ps_avx512vl(auVar111,auVar108,ZEXT1632(auVar99));
            auVar111 = vmaxps_avx(auVar115,auVar109);
            uVar156 = vcmpps_avx512vl(auVar111,auVar108,2);
            local_2d0 = local_2d0 & (byte)uVar156;
            auVar222 = ZEXT3264(auVar169);
            if (local_2d0 == 0) {
LAB_01e73759:
              local_2d0 = 0;
            }
            else {
              auVar70._4_4_ = auVar113._4_4_ * auVar110._4_4_;
              auVar70._0_4_ = auVar113._0_4_ * auVar110._0_4_;
              auVar70._8_4_ = auVar113._8_4_ * auVar110._8_4_;
              auVar70._12_4_ = auVar113._12_4_ * auVar110._12_4_;
              auVar70._16_4_ = auVar113._16_4_ * auVar110._16_4_;
              auVar70._20_4_ = auVar113._20_4_ * auVar110._20_4_;
              auVar70._24_4_ = auVar113._24_4_ * auVar110._24_4_;
              auVar70._28_4_ = auVar111._28_4_;
              auVar226 = vfmsub231ps_fma(auVar70,auVar112,auVar122);
              auVar71._4_4_ = auVar122._4_4_ * auVar121._4_4_;
              auVar71._0_4_ = auVar122._0_4_ * auVar121._0_4_;
              auVar71._8_4_ = auVar122._8_4_ * auVar121._8_4_;
              auVar71._12_4_ = auVar122._12_4_ * auVar121._12_4_;
              auVar71._16_4_ = auVar122._16_4_ * auVar121._16_4_;
              auVar71._20_4_ = auVar122._20_4_ * auVar121._20_4_;
              auVar71._24_4_ = auVar122._24_4_ * auVar121._24_4_;
              auVar71._28_4_ = auVar122._28_4_;
              auVar101 = vfmsub231ps_fma(auVar71,auVar120,auVar113);
              auVar72._4_4_ = auVar112._4_4_ * auVar120._4_4_;
              auVar72._0_4_ = auVar112._0_4_ * auVar120._0_4_;
              auVar72._8_4_ = auVar112._8_4_ * auVar120._8_4_;
              auVar72._12_4_ = auVar112._12_4_ * auVar120._12_4_;
              auVar72._16_4_ = auVar112._16_4_ * auVar120._16_4_;
              auVar72._20_4_ = auVar112._20_4_ * auVar120._20_4_;
              auVar72._24_4_ = auVar112._24_4_ * auVar120._24_4_;
              auVar72._28_4_ = auVar112._28_4_;
              auVar6 = vfmsub231ps_fma(auVar72,auVar121,auVar110);
              auVar99 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar101),ZEXT1632(auVar6));
              auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar226),auVar108);
              auVar110 = vrcp14ps_avx512vl(auVar111);
              auVar33._8_4_ = 0x3f800000;
              auVar33._0_8_ = &DAT_3f8000003f800000;
              auVar33._12_4_ = 0x3f800000;
              auVar33._16_4_ = 0x3f800000;
              auVar33._20_4_ = 0x3f800000;
              auVar33._24_4_ = 0x3f800000;
              auVar33._28_4_ = 0x3f800000;
              auVar122 = vfnmadd213ps_avx512vl(auVar110,auVar111,auVar33);
              auVar99 = vfmadd132ps_fma(auVar122,auVar110,auVar110);
              auVar73._4_4_ = auVar6._4_4_ * auVar139._4_4_;
              auVar73._0_4_ = auVar6._0_4_ * auVar139._0_4_;
              auVar73._8_4_ = auVar6._8_4_ * auVar139._8_4_;
              auVar73._12_4_ = auVar6._12_4_ * auVar139._12_4_;
              auVar73._16_4_ = fVar187 * 0.0;
              auVar73._20_4_ = fVar154 * 0.0;
              auVar73._24_4_ = fVar186 * 0.0;
              auVar73._28_4_ = iVar1;
              auVar101 = vfmadd231ps_fma(auVar73,auVar116,ZEXT1632(auVar101));
              auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar114,ZEXT1632(auVar226));
              fVar187 = auVar99._0_4_;
              fVar154 = auVar99._4_4_;
              fVar186 = auVar99._8_4_;
              fVar192 = auVar99._12_4_;
              auVar110 = ZEXT1632(CONCAT412(auVar101._12_4_ * fVar192,
                                            CONCAT48(auVar101._8_4_ * fVar186,
                                                     CONCAT44(auVar101._4_4_ * fVar154,
                                                              auVar101._0_4_ * fVar187))));
              auVar86._4_4_ = uStack_3bc;
              auVar86._0_4_ = local_3c0;
              auVar86._8_4_ = uStack_3b8;
              auVar86._12_4_ = uStack_3b4;
              auVar86._16_4_ = uStack_3b0;
              auVar86._20_4_ = uStack_3ac;
              auVar86._24_4_ = uStack_3a8;
              auVar86._28_4_ = uStack_3a4;
              uVar156 = vcmpps_avx512vl(auVar110,auVar86,0xd);
              uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar34._4_4_ = uVar155;
              auVar34._0_4_ = uVar155;
              auVar34._8_4_ = uVar155;
              auVar34._12_4_ = uVar155;
              auVar34._16_4_ = uVar155;
              auVar34._20_4_ = uVar155;
              auVar34._24_4_ = uVar155;
              auVar34._28_4_ = uVar155;
              uVar25 = vcmpps_avx512vl(auVar110,auVar34,2);
              local_2d0 = (byte)uVar156 & (byte)uVar25 & local_2d0;
              if (local_2d0 == 0) goto LAB_01e73759;
              uVar156 = vcmpps_avx512vl(auVar111,auVar108,4);
              if ((local_2d0 & (byte)uVar156) == 0) {
                local_2d0 = 0;
              }
              else {
                local_2d0 = local_2d0 & (byte)uVar156;
                fVar193 = auVar115._0_4_ * fVar187;
                fVar194 = auVar115._4_4_ * fVar154;
                auVar74._4_4_ = fVar194;
                auVar74._0_4_ = fVar193;
                fVar178 = auVar115._8_4_ * fVar186;
                auVar74._8_4_ = fVar178;
                fVar185 = auVar115._12_4_ * fVar192;
                auVar74._12_4_ = fVar185;
                fVar98 = auVar115._16_4_ * 0.0;
                auVar74._16_4_ = fVar98;
                fVar177 = auVar115._20_4_ * 0.0;
                auVar74._20_4_ = fVar177;
                fVar147 = auVar115._24_4_ * 0.0;
                auVar74._24_4_ = fVar147;
                auVar74._28_4_ = auVar115._28_4_;
                fVar187 = auVar109._0_4_ * fVar187;
                fVar154 = auVar109._4_4_ * fVar154;
                auVar75._4_4_ = fVar154;
                auVar75._0_4_ = fVar187;
                fVar186 = auVar109._8_4_ * fVar186;
                auVar75._8_4_ = fVar186;
                fVar192 = auVar109._12_4_ * fVar192;
                auVar75._12_4_ = fVar192;
                fVar148 = auVar109._16_4_ * 0.0;
                auVar75._16_4_ = fVar148;
                fVar149 = auVar109._20_4_ * 0.0;
                auVar75._20_4_ = fVar149;
                fVar150 = auVar109._24_4_ * 0.0;
                auVar75._24_4_ = fVar150;
                auVar75._28_4_ = auVar109._28_4_;
                auVar202._8_4_ = 0x3f800000;
                auVar202._0_8_ = &DAT_3f8000003f800000;
                auVar202._12_4_ = 0x3f800000;
                auVar202._16_4_ = 0x3f800000;
                auVar202._20_4_ = 0x3f800000;
                auVar202._24_4_ = 0x3f800000;
                auVar202._28_4_ = 0x3f800000;
                auVar111 = vsubps_avx(auVar202,auVar74);
                local_5c0._0_4_ =
                     (uint)(bVar96 & 1) * (int)fVar193 | (uint)!(bool)(bVar96 & 1) * auVar111._0_4_;
                bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
                local_5c0._4_4_ = (uint)bVar18 * (int)fVar194 | (uint)!bVar18 * auVar111._4_4_;
                bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                local_5c0._8_4_ = (uint)bVar18 * (int)fVar178 | (uint)!bVar18 * auVar111._8_4_;
                bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
                local_5c0._12_4_ = (uint)bVar18 * (int)fVar185 | (uint)!bVar18 * auVar111._12_4_;
                bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
                local_5c0._16_4_ = (uint)bVar18 * (int)fVar98 | (uint)!bVar18 * auVar111._16_4_;
                bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
                local_5c0._20_4_ = (uint)bVar18 * (int)fVar177 | (uint)!bVar18 * auVar111._20_4_;
                bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
                local_5c0._24_4_ = (uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar111._24_4_;
                bVar18 = SUB81(uVar89 >> 7,0);
                local_5c0._28_4_ = (uint)bVar18 * auVar115._28_4_ | (uint)!bVar18 * auVar111._28_4_;
                auVar111 = vsubps_avx(auVar202,auVar75);
                bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
                bVar19 = (bool)((byte)(uVar89 >> 2) & 1);
                bVar20 = (bool)((byte)(uVar89 >> 3) & 1);
                bVar21 = (bool)((byte)(uVar89 >> 4) & 1);
                bVar22 = (bool)((byte)(uVar89 >> 5) & 1);
                bVar23 = (bool)((byte)(uVar89 >> 6) & 1);
                bVar24 = SUB81(uVar89 >> 7,0);
                local_1c0._4_4_ = (uint)bVar18 * (int)fVar154 | (uint)!bVar18 * auVar111._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar96 & 1) * (int)fVar187 | (uint)!(bool)(bVar96 & 1) * auVar111._0_4_;
                local_1c0._8_4_ = (uint)bVar19 * (int)fVar186 | (uint)!bVar19 * auVar111._8_4_;
                local_1c0._12_4_ = (uint)bVar20 * (int)fVar192 | (uint)!bVar20 * auVar111._12_4_;
                local_1c0._16_4_ = (uint)bVar21 * (int)fVar148 | (uint)!bVar21 * auVar111._16_4_;
                local_1c0._20_4_ = (uint)bVar22 * (int)fVar149 | (uint)!bVar22 * auVar111._20_4_;
                local_1c0._24_4_ = (uint)bVar23 * (int)fVar150 | (uint)!bVar23 * auVar111._24_4_;
                local_1c0._28_4_ = (uint)bVar24 * auVar109._28_4_ | (uint)!bVar24 * auVar111._28_4_;
                local_5e0 = auVar110;
              }
            }
            auVar231 = ZEXT3264(local_660);
            if (local_2d0 != 0) {
              auVar111 = vsubps_avx(ZEXT1632(auVar100),auVar117);
              auVar99 = vfmadd213ps_fma(auVar111,local_5c0,auVar117);
              uVar155 = *(undefined4 *)((long)local_6b8->ray_space + k * 4 + -0x10);
              auVar35._4_4_ = uVar155;
              auVar35._0_4_ = uVar155;
              auVar35._8_4_ = uVar155;
              auVar35._12_4_ = uVar155;
              auVar35._16_4_ = uVar155;
              auVar35._20_4_ = uVar155;
              auVar35._24_4_ = uVar155;
              auVar35._28_4_ = uVar155;
              auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar99._12_4_ + auVar99._12_4_,
                                                            CONCAT48(auVar99._8_4_ + auVar99._8_4_,
                                                                     CONCAT44(auVar99._4_4_ +
                                                                              auVar99._4_4_,
                                                                              auVar99._0_4_ +
                                                                              auVar99._0_4_)))),
                                         auVar35);
              uVar156 = vcmpps_avx512vl(local_5e0,auVar111,6);
              local_2d0 = local_2d0 & (byte)uVar156;
              if (local_2d0 != 0) {
                auVar164._8_4_ = 0xbf800000;
                auVar164._0_8_ = 0xbf800000bf800000;
                auVar164._12_4_ = 0xbf800000;
                auVar164._16_4_ = 0xbf800000;
                auVar164._20_4_ = 0xbf800000;
                auVar164._24_4_ = 0xbf800000;
                auVar164._28_4_ = 0xbf800000;
                auVar36._8_4_ = 0x40000000;
                auVar36._0_8_ = 0x4000000040000000;
                auVar36._12_4_ = 0x40000000;
                auVar36._16_4_ = 0x40000000;
                auVar36._20_4_ = 0x40000000;
                auVar36._24_4_ = 0x40000000;
                auVar36._28_4_ = 0x40000000;
                local_360 = vfmadd132ps_avx512vl(local_1c0,auVar164,auVar36);
                local_1c0 = local_360;
                auVar111 = local_1c0;
                local_320 = (undefined4)lVar92;
                local_310 = local_6b0._0_8_;
                uStack_308 = local_6b0._8_8_;
                local_300 = local_5f0._0_8_;
                uStack_2f8 = local_5f0._8_8_;
                local_2f0 = local_600._0_8_;
                uStack_2e8 = local_600._8_8_;
                local_2e0 = local_610;
                uStack_2d8 = uStack_608;
                pGVar94 = (context->scene->geometries).items[uVar95].ptr;
                local_1c0 = auVar111;
                if ((pGVar94->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar99 = vcvtsi2ss_avx512f(auVar221._0_16_,local_320);
                  fVar187 = auVar99._0_4_;
                  local_2c0[0] = (fVar187 + local_5c0._0_4_ + 0.0) * (float)local_3a0._0_4_;
                  local_2c0[1] = (fVar187 + local_5c0._4_4_ + 1.0) * (float)local_3a0._4_4_;
                  local_2c0[2] = (fVar187 + local_5c0._8_4_ + 2.0) * fStack_398;
                  local_2c0[3] = (fVar187 + local_5c0._12_4_ + 3.0) * fStack_394;
                  fStack_2b0 = (fVar187 + local_5c0._16_4_ + 4.0) * fStack_390;
                  fStack_2ac = (fVar187 + local_5c0._20_4_ + 5.0) * fStack_38c;
                  fStack_2a8 = (fVar187 + local_5c0._24_4_ + 6.0) * fStack_388;
                  fStack_2a4 = fVar187 + local_5c0._28_4_ + 7.0;
                  local_1c0._0_8_ = local_360._0_8_;
                  local_1c0._8_8_ = local_360._8_8_;
                  local_1c0._16_8_ = local_360._16_8_;
                  local_1c0._24_8_ = local_360._24_8_;
                  local_2a0 = local_1c0._0_8_;
                  uStack_298 = local_1c0._8_8_;
                  uStack_290 = local_1c0._16_8_;
                  uStack_288 = local_1c0._24_8_;
                  local_280 = local_5e0;
                  auVar165._8_4_ = 0x7f800000;
                  auVar165._0_8_ = 0x7f8000007f800000;
                  auVar165._12_4_ = 0x7f800000;
                  auVar165._16_4_ = 0x7f800000;
                  auVar165._20_4_ = 0x7f800000;
                  auVar165._24_4_ = 0x7f800000;
                  auVar165._28_4_ = 0x7f800000;
                  auVar111 = vblendmps_avx512vl(auVar165,local_5e0);
                  auVar144._0_4_ =
                       (uint)(local_2d0 & 1) * auVar111._0_4_ |
                       (uint)!(bool)(local_2d0 & 1) * 0x7f800000;
                  bVar18 = (bool)(local_2d0 >> 1 & 1);
                  auVar144._4_4_ = (uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)(local_2d0 >> 2 & 1);
                  auVar144._8_4_ = (uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)(local_2d0 >> 3 & 1);
                  auVar144._12_4_ = (uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)(local_2d0 >> 4 & 1);
                  auVar144._16_4_ = (uint)bVar18 * auVar111._16_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)(local_2d0 >> 5 & 1);
                  auVar144._20_4_ = (uint)bVar18 * auVar111._20_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)(local_2d0 >> 6 & 1);
                  auVar144._24_4_ = (uint)bVar18 * auVar111._24_4_ | (uint)!bVar18 * 0x7f800000;
                  auVar144._28_4_ =
                       (uint)(local_2d0 >> 7) * auVar111._28_4_ |
                       (uint)!(bool)(local_2d0 >> 7) * 0x7f800000;
                  auVar111 = vshufps_avx(auVar144,auVar144,0xb1);
                  auVar111 = vminps_avx(auVar144,auVar111);
                  auVar110 = vshufpd_avx(auVar111,auVar111,5);
                  auVar111 = vminps_avx(auVar111,auVar110);
                  auVar110 = vpermpd_avx2(auVar111,0x4e);
                  auVar111 = vminps_avx(auVar111,auVar110);
                  uVar156 = vcmpps_avx512vl(auVar144,auVar111,0);
                  bVar88 = (byte)uVar156 & local_2d0;
                  bVar96 = local_2d0;
                  if (bVar88 != 0) {
                    bVar96 = bVar88;
                  }
                  uVar26 = 0;
                  for (uVar90 = (uint)bVar96; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000)
                  {
                    uVar26 = uVar26 + 1;
                  }
                  uVar89 = (ulong)uVar26;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar94->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar187 = local_2c0[uVar89];
                    uVar155 = *(undefined4 *)((long)&local_2a0 + uVar89 * 4);
                    fVar186 = 1.0 - fVar187;
                    fVar154 = fVar186 * fVar186 * -3.0;
                    auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar186 * fVar186)),
                                              ZEXT416((uint)(fVar187 * fVar186)),ZEXT416(0xc0000000)
                                             );
                    auVar100 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar186)),
                                               ZEXT416((uint)(fVar187 * fVar187)),
                                               ZEXT416(0x40000000));
                    fVar186 = auVar99._0_4_ * 3.0;
                    fVar192 = auVar100._0_4_ * 3.0;
                    fVar193 = fVar187 * fVar187 * 3.0;
                    auVar196._0_4_ = fVar193 * (float)local_610._0_4_;
                    auVar196._4_4_ = fVar193 * (float)local_610._4_4_;
                    auVar196._8_4_ = fVar193 * (float)uStack_608;
                    auVar196._12_4_ = fVar193 * uStack_608._4_4_;
                    auVar174._4_4_ = fVar192;
                    auVar174._0_4_ = fVar192;
                    auVar174._8_4_ = fVar192;
                    auVar174._12_4_ = fVar192;
                    auVar99 = vfmadd132ps_fma(auVar174,auVar196,local_600);
                    auVar180._4_4_ = fVar186;
                    auVar180._0_4_ = fVar186;
                    auVar180._8_4_ = fVar186;
                    auVar180._12_4_ = fVar186;
                    auVar99 = vfmadd132ps_fma(auVar180,auVar99,local_5f0);
                    auVar175._4_4_ = fVar154;
                    auVar175._0_4_ = fVar154;
                    auVar175._8_4_ = fVar154;
                    auVar175._12_4_ = fVar154;
                    auVar99 = vfmadd132ps_fma(auVar175,auVar99,local_6b0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar89 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar99._0_4_;
                    uVar14 = vextractps_avx(auVar99,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar14;
                    uVar14 = vextractps_avx(auVar99,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                    *(float *)(ray + k * 4 + 0xf0) = fVar187;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar155;
                    *(uint *)(ray + k * 4 + 0x110) = uVar12;
                    *(uint *)(ray + k * 4 + 0x120) = uVar95;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_4f0 = local_5f0._0_8_;
                    uStack_4e8 = local_5f0._8_8_;
                    local_500 = local_600._0_4_;
                    fStack_4fc = local_600._4_4_;
                    fStack_4f8 = local_600._8_4_;
                    fStack_4f4 = local_600._12_4_;
                    _local_630 = _local_610;
                    local_180 = vmovdqa64_avx512vl(auVar216._0_32_);
                    local_668 = pGVar94;
                    local_380 = local_5c0;
                    local_340 = local_5e0;
                    local_31c = iVar13;
                    bVar96 = local_2d0;
                    do {
                      auVar101 = local_620;
                      auVar226 = auVar227._0_16_;
                      local_4e0 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_220 = local_2c0[uVar89];
                      local_210 = *(undefined4 *)((long)&local_2a0 + uVar89 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar89 * 4);
                      local_698.context = context->user;
                      fVar154 = 1.0 - local_220;
                      fVar187 = fVar154 * fVar154 * -3.0;
                      auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154)),
                                                ZEXT416((uint)(local_220 * fVar154)),
                                                ZEXT416(0xc0000000));
                      auVar100 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar154)),
                                                 ZEXT416((uint)(local_220 * local_220)),
                                                 ZEXT416(0x40000000));
                      fVar154 = auVar99._0_4_ * 3.0;
                      fVar186 = auVar100._0_4_ * 3.0;
                      fVar192 = local_220 * local_220 * 3.0;
                      auVar197._0_4_ = fVar192 * (float)local_630._0_4_;
                      auVar197._4_4_ = fVar192 * (float)local_630._4_4_;
                      auVar197._8_4_ = fVar192 * fStack_628;
                      auVar197._12_4_ = fVar192 * fStack_624;
                      auVar157._4_4_ = fVar186;
                      auVar157._0_4_ = fVar186;
                      auVar157._8_4_ = fVar186;
                      auVar157._12_4_ = fVar186;
                      auVar81._4_4_ = fStack_4fc;
                      auVar81._0_4_ = local_500;
                      auVar81._8_4_ = fStack_4f8;
                      auVar81._12_4_ = fStack_4f4;
                      auVar99 = vfmadd132ps_fma(auVar157,auVar197,auVar81);
                      auVar181._4_4_ = fVar154;
                      auVar181._0_4_ = fVar154;
                      auVar181._8_4_ = fVar154;
                      auVar181._12_4_ = fVar154;
                      auVar82._8_8_ = uStack_4e8;
                      auVar82._0_8_ = local_4f0;
                      auVar99 = vfmadd132ps_fma(auVar181,auVar99,auVar82);
                      auVar158._4_4_ = fVar187;
                      auVar158._0_4_ = fVar187;
                      auVar158._8_4_ = fVar187;
                      auVar158._12_4_ = fVar187;
                      auVar99 = vfmadd132ps_fma(auVar158,auVar99,local_6b0);
                      local_250 = auVar99._0_4_;
                      local_240 = vshufps_avx(auVar99,auVar99,0x55);
                      local_230 = vshufps_avx(auVar99,auVar99,0xaa);
                      iStack_24c = local_250;
                      iStack_248 = local_250;
                      iStack_244 = local_250;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      uStack_20c = local_210;
                      uStack_208 = local_210;
                      uStack_204 = local_210;
                      local_200 = local_4d0._0_8_;
                      uStack_1f8 = local_4d0._8_8_;
                      local_1f0 = local_4c0;
                      vpcmpeqd_avx2(ZEXT1632(local_4c0),ZEXT1632(local_4c0));
                      uStack_1dc = (local_698.context)->instID[0];
                      local_1e0 = uStack_1dc;
                      uStack_1d8 = uStack_1dc;
                      uStack_1d4 = uStack_1dc;
                      uStack_1d0 = (local_698.context)->instPrimID[0];
                      uStack_1cc = uStack_1d0;
                      uStack_1c8 = uStack_1d0;
                      uStack_1c4 = uStack_1d0;
                      local_6d0 = local_3d0._0_8_;
                      uStack_6c8 = local_3d0._8_8_;
                      local_698.valid = (int *)&local_6d0;
                      local_698.geometryUserPtr = pGVar94->userPtr;
                      local_698.hit = (RTCHitN *)&local_250;
                      local_698.N = 4;
                      local_620._1_3_ = 0;
                      local_620[0] = bVar96;
                      local_620._4_12_ = auVar101._4_12_;
                      local_698.ray = (RTCRayN *)ray;
                      if (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar94->intersectionFilterN)(&local_698);
                        auVar111 = vmovdqa64_avx512vl(local_180);
                        auVar216 = ZEXT3264(auVar111);
                        auVar230 = ZEXT3264(local_560);
                        auVar229 = ZEXT3264(local_540);
                        auVar228 = ZEXT3264(local_520);
                        auVar231 = ZEXT3264(local_660);
                        auVar222 = ZEXT3264(local_460);
                        auVar225 = ZEXT3264(local_440);
                        auVar224 = ZEXT3264(local_400);
                        auVar223 = ZEXT3264(local_420);
                        auVar99 = vxorps_avx512vl(auVar226,auVar226);
                        auVar227 = ZEXT1664(auVar99);
                        pGVar94 = local_668;
                        bVar96 = local_620[0];
                      }
                      auVar99 = auVar227._0_16_;
                      auVar77._8_8_ = uStack_6c8;
                      auVar77._0_8_ = local_6d0;
                      uVar97 = vptestmd_avx512vl(auVar77,auVar77);
                      if ((uVar97 & 0xf) == 0) {
LAB_01e73ba4:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_4e0;
                      }
                      else {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar94->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var17)(&local_698);
                          bVar96 = local_620[0];
                          auVar111 = vmovdqa64_avx512vl(local_180);
                          auVar216 = ZEXT3264(auVar111);
                          auVar230 = ZEXT3264(local_560);
                          auVar229 = ZEXT3264(local_540);
                          auVar228 = ZEXT3264(local_520);
                          auVar231 = ZEXT3264(local_660);
                          auVar222 = ZEXT3264(local_460);
                          auVar225 = ZEXT3264(local_440);
                          auVar224 = ZEXT3264(local_400);
                          auVar223 = ZEXT3264(local_420);
                          auVar99 = vxorps_avx512vl(auVar99,auVar99);
                          auVar227 = ZEXT1664(auVar99);
                          pGVar94 = local_668;
                        }
                        auVar78._8_8_ = uStack_6c8;
                        auVar78._0_8_ = local_6d0;
                        uVar97 = vptestmd_avx512vl(auVar78,auVar78);
                        uVar97 = uVar97 & 0xf;
                        bVar88 = (byte)uVar97;
                        if (bVar88 == 0) goto LAB_01e73ba4;
                        iVar1 = *(int *)(local_698.hit + 4);
                        iVar2 = *(int *)(local_698.hit + 8);
                        iVar76 = *(int *)(local_698.hit + 0xc);
                        bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar20 = SUB81(uVar97 >> 3,0);
                        *(uint *)(local_698.ray + 0xc0) =
                             (uint)(bVar88 & 1) * *(int *)local_698.hit |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_698.ray + 0xc0);
                        *(uint *)(local_698.ray + 0xc4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_698.ray + 0xc4);
                        *(uint *)(local_698.ray + 200) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_698.ray + 200);
                        *(uint *)(local_698.ray + 0xcc) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_698.ray + 0xcc);
                        iVar1 = *(int *)(local_698.hit + 0x14);
                        iVar2 = *(int *)(local_698.hit + 0x18);
                        iVar76 = *(int *)(local_698.hit + 0x1c);
                        bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar20 = SUB81(uVar97 >> 3,0);
                        *(uint *)(local_698.ray + 0xd0) =
                             (uint)(bVar88 & 1) * *(int *)(local_698.hit + 0x10) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_698.ray + 0xd0);
                        *(uint *)(local_698.ray + 0xd4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_698.ray + 0xd4);
                        *(uint *)(local_698.ray + 0xd8) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_698.ray + 0xd8);
                        *(uint *)(local_698.ray + 0xdc) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_698.ray + 0xdc);
                        iVar1 = *(int *)(local_698.hit + 0x24);
                        iVar2 = *(int *)(local_698.hit + 0x28);
                        iVar76 = *(int *)(local_698.hit + 0x2c);
                        bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar20 = SUB81(uVar97 >> 3,0);
                        *(uint *)(local_698.ray + 0xe0) =
                             (uint)(bVar88 & 1) * *(int *)(local_698.hit + 0x20) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_698.ray + 0xe0);
                        *(uint *)(local_698.ray + 0xe4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_698.ray + 0xe4);
                        *(uint *)(local_698.ray + 0xe8) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_698.ray + 0xe8);
                        *(uint *)(local_698.ray + 0xec) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_698.ray + 0xec);
                        iVar1 = *(int *)(local_698.hit + 0x34);
                        iVar2 = *(int *)(local_698.hit + 0x38);
                        iVar76 = *(int *)(local_698.hit + 0x3c);
                        bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar20 = SUB81(uVar97 >> 3,0);
                        *(uint *)(local_698.ray + 0xf0) =
                             (uint)(bVar88 & 1) * *(int *)(local_698.hit + 0x30) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_698.ray + 0xf0);
                        *(uint *)(local_698.ray + 0xf4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_698.ray + 0xf4);
                        *(uint *)(local_698.ray + 0xf8) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_698.ray + 0xf8);
                        *(uint *)(local_698.ray + 0xfc) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_698.ray + 0xfc);
                        auVar99 = *(undefined1 (*) [16])(local_698.ray + 0x100);
                        auVar105._0_4_ =
                             (uint)(bVar88 & 1) * *(int *)(local_698.hit + 0x40) |
                             (uint)!(bool)(bVar88 & 1) * auVar99._0_4_;
                        bVar18 = (bool)((byte)(uVar97 >> 1) & 1);
                        auVar105._4_4_ =
                             (uint)bVar18 * *(int *)(local_698.hit + 0x44) |
                             (uint)!bVar18 * auVar99._4_4_;
                        bVar18 = (bool)((byte)(uVar97 >> 2) & 1);
                        auVar105._8_4_ =
                             (uint)bVar18 * *(int *)(local_698.hit + 0x48) |
                             (uint)!bVar18 * auVar99._8_4_;
                        bVar18 = SUB81(uVar97 >> 3,0);
                        auVar105._12_4_ =
                             (uint)bVar18 * *(int *)(local_698.hit + 0x4c) |
                             (uint)!bVar18 * auVar99._12_4_;
                        *(undefined1 (*) [16])(local_698.ray + 0x100) = auVar105;
                        auVar99 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x50));
                        *(undefined1 (*) [16])(local_698.ray + 0x110) = auVar99;
                        auVar99 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x60));
                        *(undefined1 (*) [16])(local_698.ray + 0x120) = auVar99;
                        auVar99 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x70));
                        *(undefined1 (*) [16])(local_698.ray + 0x130) = auVar99;
                        auVar99 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x80));
                        *(undefined1 (*) [16])(local_698.ray + 0x140) = auVar99;
                      }
                      bVar88 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & bVar96;
                      uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar37._4_4_ = uVar155;
                      auVar37._0_4_ = uVar155;
                      auVar37._8_4_ = uVar155;
                      auVar37._12_4_ = uVar155;
                      auVar37._16_4_ = uVar155;
                      auVar37._20_4_ = uVar155;
                      auVar37._24_4_ = uVar155;
                      auVar37._28_4_ = uVar155;
                      uVar156 = vcmpps_avx512vl(local_5e0,auVar37,2);
                      bVar96 = bVar88 & (byte)uVar156;
                      if ((bVar88 & (byte)uVar156) != 0) {
                        auVar166._8_4_ = 0x7f800000;
                        auVar166._0_8_ = 0x7f8000007f800000;
                        auVar166._12_4_ = 0x7f800000;
                        auVar166._16_4_ = 0x7f800000;
                        auVar166._20_4_ = 0x7f800000;
                        auVar166._24_4_ = 0x7f800000;
                        auVar166._28_4_ = 0x7f800000;
                        auVar111 = vblendmps_avx512vl(auVar166,local_5e0);
                        auVar145._0_4_ =
                             (uint)(bVar96 & 1) * auVar111._0_4_ |
                             (uint)!(bool)(bVar96 & 1) * 0x7f800000;
                        bVar18 = (bool)(bVar96 >> 1 & 1);
                        auVar145._4_4_ = (uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar96 >> 2 & 1);
                        auVar145._8_4_ = (uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar96 >> 3 & 1);
                        auVar145._12_4_ =
                             (uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar96 >> 4 & 1);
                        auVar145._16_4_ =
                             (uint)bVar18 * auVar111._16_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar96 >> 5 & 1);
                        auVar145._20_4_ =
                             (uint)bVar18 * auVar111._20_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar96 >> 6 & 1);
                        auVar145._24_4_ =
                             (uint)bVar18 * auVar111._24_4_ | (uint)!bVar18 * 0x7f800000;
                        auVar145._28_4_ =
                             (uint)(bVar96 >> 7) * auVar111._28_4_ |
                             (uint)!(bool)(bVar96 >> 7) * 0x7f800000;
                        auVar111 = vshufps_avx(auVar145,auVar145,0xb1);
                        auVar111 = vminps_avx(auVar145,auVar111);
                        auVar110 = vshufpd_avx(auVar111,auVar111,5);
                        auVar111 = vminps_avx(auVar111,auVar110);
                        auVar110 = vpermpd_avx2(auVar111,0x4e);
                        auVar111 = vminps_avx(auVar111,auVar110);
                        uVar156 = vcmpps_avx512vl(auVar145,auVar111,0);
                        bVar87 = (byte)uVar156 & bVar96;
                        bVar88 = bVar96;
                        if (bVar87 != 0) {
                          bVar88 = bVar87;
                        }
                        uVar26 = 0;
                        for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0;
                            uVar90 = uVar90 >> 1 | 0x80000000) {
                          uVar26 = uVar26 + 1;
                        }
                        uVar89 = (ulong)uVar26;
                      }
                    } while (bVar96 != 0);
                  }
                }
              }
            }
          }
          lVar92 = lVar92 + 8;
          auVar221 = auVar222;
        } while ((int)lVar92 < iVar13);
      }
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar155;
      auVar32._0_4_ = uVar155;
      auVar32._8_4_ = uVar155;
      auVar32._12_4_ = uVar155;
      auVar32._16_4_ = uVar155;
      auVar32._20_4_ = uVar155;
      auVar32._24_4_ = uVar155;
      auVar32._28_4_ = uVar155;
      uVar156 = vcmpps_avx512vl(local_80,auVar32,2);
      uVar95 = (uint)uVar91 & (uint)uVar91 + 0xff & (uint)uVar156;
      uVar91 = (ulong)uVar95;
    } while (uVar95 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }